

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

void ncnn::transpose_unpack_output_tile(Mat *topT,Mat *top_blob,int i,int max_ii,int j,int max_jj)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  int iVar101;
  int iVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  Allocator *pAVar114;
  undefined8 uVar115;
  int *piVar116;
  size_t sVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  int iVar121;
  uint uVar122;
  int iVar123;
  int iVar124;
  size_t *psVar125;
  long lVar126;
  ulong uVar127;
  Mat *pMVar128;
  int iVar129;
  uint uVar130;
  int iVar131;
  ulong uVar132;
  undefined1 (*pauVar133) [32];
  undefined1 (*pauVar134) [16];
  ulong uVar135;
  undefined4 *puVar136;
  undefined8 *puVar137;
  int iVar138;
  uint uVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 (*pauVar143) [64];
  long lVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  __m128 tmp1;
  __m128 tmp1_1;
  undefined1 auVar199 [32];
  __m128 tmp2;
  __m128 tmp3;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  long local_100;
  long local_98;
  long local_90;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_58;
  long local_50;
  
  psVar125 = (size_t *)&top_blob->w;
  if (top_blob->dims == 3) {
    psVar125 = &top_blob->cstep;
  }
  iVar101 = top_blob->elempack;
  iVar102 = (int)*psVar125;
  uVar132 = 0;
  if (0xf < max_ii) {
    uVar130 = j + 7;
    iVar123 = j + 0xf;
    if (-1 < j) {
      uVar130 = j;
      iVar123 = j;
    }
    iVar138 = iVar102 * 8;
    iVar129 = j % 0x10;
    lVar145 = (long)(iVar102 * 0x10);
    lVar147 = (long)i;
    lVar142 = lVar145 * 4;
    lVar144 = (long)iVar138 * 4;
    lVar141 = lVar147 * 0x10 + (long)(iVar102 * j) * 4 + 0xc0;
    lVar148 = (long)(iVar102 * j) * 4 + lVar147 * 4;
    uVar135 = 0;
    do {
      if (iVar101 == 0x10) {
        pauVar143 = (undefined1 (*) [64])
                    ((long)top_blob->data +
                    (lVar147 + uVar135) * 0x40 + (long)((iVar123 >> 4) * iVar102 * 0x10) * 4);
        if (iVar129 == 0xc) {
          auVar175._0_8_ = topT->data;
          auVar175._8_8_ = topT->refcount;
          auVar175._16_8_ = topT->elemsize;
          auVar175._24_4_ = topT->elempack;
          auVar175._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar175._32_8_ = topT->allocator;
          auVar175._40_4_ = topT->dims;
          auVar175._44_4_ = topT->w;
          auVar175._48_4_ = topT->h;
          auVar175._52_4_ = topT->d;
          auVar175._56_4_ = topT->c;
          auVar175._60_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar176 = vunpcklps_avx512f(auVar175,*(undefined1 (*) [64])&topT->cstep);
          auVar175 = vunpckhps_avx512f(auVar175,*(undefined1 (*) [64])&topT->cstep);
          auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar184 = vunpcklpd_avx512f(auVar176,auVar177);
          auVar176 = vunpckhpd_avx512f(auVar176,auVar177);
          auVar177 = vunpcklpd_avx512f(auVar175,auVar178);
          auVar175 = vunpckhpd_avx512f(auVar175,auVar178);
          *(undefined1 (*) [16])(*pauVar143 + 0x30) = auVar184._0_16_;
          *(undefined1 (*) [16])(pauVar143[1] + 0x30) = auVar176._0_16_;
          *(undefined1 (*) [16])(pauVar143[2] + 0x30) = auVar177._0_16_;
          *(undefined1 (*) [16])(pauVar143[3] + 0x30) = auVar175._0_16_;
          auVar149 = vextractf32x4_avx512f(auVar184,1);
          *(undefined1 (*) [16])(pauVar143[2] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,1);
          *(undefined1 (*) [16])(pauVar143[2] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar177,1);
          *(undefined1 (*) [16])(pauVar143[3] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,1);
          *(undefined1 (*) [16])(pauVar143[3] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar184,2);
          *(undefined1 (*) [16])(pauVar143[4] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,2);
          *(undefined1 (*) [16])(pauVar143[4] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar177,2);
          *(undefined1 (*) [16])(pauVar143[5] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,2);
          *(undefined1 (*) [16])(pauVar143[5] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar184,3);
          *(undefined1 (*) [16])(pauVar143[6] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,3);
          *(undefined1 (*) [16])(pauVar143[6] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar177,3);
          *(undefined1 (*) [16])(pauVar143[7] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,3);
          *(undefined1 (*) [16])(pauVar143[7] + 0x38) = auVar149;
          topT = (Mat *)&topT[3].dims;
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar145 * 4);
          iVar131 = 4;
        }
        else {
          if (iVar129 == 8) {
            auVar176._0_8_ = topT->data;
            auVar176._8_8_ = topT->refcount;
            auVar176._16_8_ = topT->elemsize;
            auVar176._24_4_ = topT->elempack;
            auVar176._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar176._32_8_ = topT->allocator;
            auVar176._40_4_ = topT->dims;
            auVar176._44_4_ = topT->w;
            auVar176._48_4_ = topT->h;
            auVar176._52_4_ = topT->d;
            auVar176._56_4_ = topT->c;
            auVar176._60_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar175 = vunpcklps_avx512f(auVar176,*(undefined1 (*) [64])&topT->cstep);
            auVar176 = vunpckhps_avx512f(auVar176,*(undefined1 (*) [64])&topT->cstep);
            auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            if (max_jj < 5) {
              auVar184 = vunpcklpd_avx512f(auVar175,auVar177);
              auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
              auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
              auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
              *(undefined1 (*) [16])(*pauVar143 + 0x20) = auVar184._0_16_;
              *(undefined1 (*) [16])(pauVar143[1] + 0x20) = auVar175._0_16_;
              *(undefined1 (*) [16])(pauVar143[2] + 0x20) = auVar177._0_16_;
              *(undefined1 (*) [16])(pauVar143[3] + 0x20) = auVar176._0_16_;
              auVar149 = vextractf32x4_avx512f(auVar184,1);
              *(undefined1 (*) [16])(pauVar143[2] + 0x10) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,1);
              *(undefined1 (*) [16])(pauVar143[2] + 0x30) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar177,1);
              *(undefined1 (*) [16])(pauVar143[3] + 0x10) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,1);
              *(undefined1 (*) [16])(pauVar143[3] + 0x30) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar184,2);
              *(undefined1 (*) [16])(pauVar143[4] + 0x10) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,2);
              *(undefined1 (*) [16])(pauVar143[4] + 0x30) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar177,2);
              *(undefined1 (*) [16])(pauVar143[5] + 0x10) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,2);
              *(undefined1 (*) [16])(pauVar143[5] + 0x30) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar184,3);
              *(undefined1 (*) [16])(pauVar143[6] + 0x10) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,3);
              *(undefined1 (*) [16])(pauVar143[6] + 0x30) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar177,3);
              *(undefined1 (*) [16])(pauVar143[7] + 0x10) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,3);
              *(undefined1 (*) [16])(pauVar143[7] + 0x30) = auVar149;
              iVar131 = 4;
              lVar126 = 0x100;
            }
            else {
              auVar184 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                           *(undefined1 (*) [64])&topT[4].allocator);
              auVar185 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                           *(undefined1 (*) [64])&topT[4].allocator);
              auVar179 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                           *(undefined1 (*) [64])&topT[6].elemsize);
              auVar180 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                           *(undefined1 (*) [64])&topT[6].elemsize);
              auVar181 = vunpcklpd_avx512f(auVar175,auVar177);
              auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
              auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
              auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
              auVar178 = vunpcklpd_avx512f(auVar184,auVar179);
              auVar184 = vunpckhpd_avx512f(auVar184,auVar179);
              auVar179 = vunpcklpd_avx512f(auVar185,auVar180);
              auVar185 = vunpckhpd_avx512f(auVar185,auVar180);
              auVar180 = vshuff64x2_avx512f(auVar181,auVar178,0x88);
              auVar182 = vshuff64x2_avx512f(auVar175,auVar184,0x88);
              auVar183 = vshuff64x2_avx512f(auVar177,auVar179,0x88);
              auVar186 = vshuff64x2_avx512f(auVar176,auVar185,0x88);
              auVar178 = vshuff64x2_avx512f(auVar181,auVar178,0xdd);
              auVar175 = vshuff64x2_avx512f(auVar175,auVar184,0xdd);
              auVar177 = vshuff64x2_avx512f(auVar177,auVar179,0xdd);
              auVar176 = vshuff64x2_avx512f(auVar176,auVar185,0xdd);
              auVar184 = vshuff64x2_avx512f(auVar180,auVar182,0x88);
              auVar185 = vshuff64x2_avx512f(auVar183,auVar186,0x88);
              auVar179 = vshuff64x2_avx512f(auVar178,auVar175,0x88);
              auVar181 = vshuff64x2_avx512f(auVar177,auVar176,0x88);
              auVar180 = vshuff64x2_avx512f(auVar180,auVar182,0xdd);
              auVar182 = vshuff64x2_avx512f(auVar183,auVar186,0xdd);
              auVar175 = vshuff64x2_avx512f(auVar178,auVar175,0xdd);
              auVar176 = vshuff64x2_avx512f(auVar177,auVar176,0xdd);
              *(undefined1 (*) [32])(*pauVar143 + 0x20) = auVar184._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar184,1);
              *(undefined1 (*) [32])(pauVar143[1] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[2] + 0x20) = auVar185._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar185,1);
              *(undefined1 (*) [32])(pauVar143[3] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[4] + 0x20) = auVar179._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar179,1);
              *(undefined1 (*) [32])(pauVar143[5] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[6] + 0x20) = auVar181._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar181,1);
              *(undefined1 (*) [32])(pauVar143[7] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[8] + 0x20) = auVar180._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar180,1);
              *(undefined1 (*) [32])(pauVar143[9] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[10] + 0x20) = auVar182._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar182,1);
              *(undefined1 (*) [32])(pauVar143[0xb] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[0xc] + 0x20) = auVar175._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar175,1);
              *(undefined1 (*) [32])(pauVar143[0xd] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[0xe] + 0x20) = auVar176._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar176,1);
              *(undefined1 (*) [32])(pauVar143[0xf] + 0x20) = auVar163;
              iVar131 = 8;
              lVar126 = 0x200;
            }
          }
          else {
            iVar131 = 0;
            if (iVar129 != 4) goto LAB_004b8bb3;
            auVar177._0_8_ = topT->data;
            auVar177._8_8_ = topT->refcount;
            auVar177._16_8_ = topT->elemsize;
            auVar177._24_4_ = topT->elempack;
            auVar177._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar177._32_8_ = topT->allocator;
            auVar177._40_4_ = topT->dims;
            auVar177._44_4_ = topT->w;
            auVar177._48_4_ = topT->h;
            auVar177._52_4_ = topT->d;
            auVar177._56_4_ = topT->c;
            auVar177._60_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar175 = vunpcklps_avx512f(auVar177,*(undefined1 (*) [64])&topT->cstep);
            auVar176 = vunpckhps_avx512f(auVar177,*(undefined1 (*) [64])&topT->cstep);
            auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            if (max_jj < 5) {
              auVar184 = vunpcklpd_avx512f(auVar175,auVar177);
              auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
              auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
              auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
              *(undefined1 (*) [16])(*pauVar143 + 0x10) = auVar184._0_16_;
              *(undefined1 (*) [16])(pauVar143[1] + 0x10) = auVar175._0_16_;
              *(undefined1 (*) [16])(pauVar143[2] + 0x10) = auVar177._0_16_;
              *(undefined1 (*) [16])(pauVar143[3] + 0x10) = auVar176._0_16_;
              auVar149 = vextractf32x4_avx512f(auVar184,1);
              *(undefined1 (*) [16])(pauVar143[2] + 8) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,1);
              *(undefined1 (*) [16])(pauVar143[2] + 0x28) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar177,1);
              *(undefined1 (*) [16])(pauVar143[3] + 8) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,1);
              *(undefined1 (*) [16])(pauVar143[3] + 0x28) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar184,2);
              *(undefined1 (*) [16])(pauVar143[4] + 8) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,2);
              *(undefined1 (*) [16])(pauVar143[4] + 0x28) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar177,2);
              *(undefined1 (*) [16])(pauVar143[5] + 8) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,2);
              *(undefined1 (*) [16])(pauVar143[5] + 0x28) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar184,3);
              *(undefined1 (*) [16])(pauVar143[6] + 8) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,3);
              *(undefined1 (*) [16])(pauVar143[6] + 0x28) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar177,3);
              *(undefined1 (*) [16])(pauVar143[7] + 8) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,3);
              iVar131 = 4;
              lVar126 = 0x100;
            }
            else {
              auVar184._0_8_ = topT[7].refcount;
              auVar184._8_8_ = topT[7].elemsize;
              auVar184._16_4_ = topT[7].elempack;
              auVar184._20_4_ = *(undefined4 *)&topT[7].field_0x1c;
              auVar184._24_8_ = topT[7].allocator;
              auVar184._32_4_ = topT[7].dims;
              auVar184._36_4_ = topT[7].w;
              auVar184._40_4_ = topT[7].h;
              auVar184._44_4_ = topT[7].d;
              auVar184._48_4_ = topT[7].c;
              auVar184._52_4_ = *(undefined4 *)&topT[7].field_0x3c;
              auVar184._56_8_ = topT[7].cstep;
              auVar185._0_8_ = topT[8].data;
              auVar185._8_8_ = topT[8].refcount;
              auVar185._16_8_ = topT[8].elemsize;
              auVar185._24_4_ = topT[8].elempack;
              auVar185._28_4_ = *(undefined4 *)&topT[8].field_0x1c;
              auVar185._32_8_ = topT[8].allocator;
              auVar185._40_4_ = topT[8].dims;
              auVar185._44_4_ = topT[8].w;
              auVar185._48_4_ = topT[8].h;
              auVar185._52_4_ = topT[8].d;
              auVar185._56_4_ = topT[8].c;
              auVar185._60_4_ = *(undefined4 *)&topT[8].field_0x3c;
              auVar179 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                           *(undefined1 (*) [64])&topT[4].allocator);
              auVar180 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                           *(undefined1 (*) [64])&topT[4].allocator);
              auVar181 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                           *(undefined1 (*) [64])&topT[6].elemsize);
              auVar182 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                           *(undefined1 (*) [64])&topT[6].elemsize);
              auVar183 = vunpcklps_avx512f(auVar184,auVar185);
              auVar184 = vunpckhps_avx512f(auVar184,auVar185);
              auVar185 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[8].cstep,
                                           *(undefined1 (*) [64])&topT[9].c);
              auVar186 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[8].cstep,
                                           *(undefined1 (*) [64])&topT[9].c);
              auVar187 = vunpcklpd_avx512f(auVar175,auVar177);
              auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
              auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
              auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
              auVar178 = vunpcklpd_avx512f(auVar179,auVar181);
              auVar179 = vunpckhpd_avx512f(auVar179,auVar181);
              auVar181 = vunpcklpd_avx512f(auVar180,auVar182);
              auVar180 = vunpckhpd_avx512f(auVar180,auVar182);
              auVar182 = vunpcklpd_avx512f(auVar183,auVar185);
              auVar185 = vunpckhpd_avx512f(auVar183,auVar185);
              auVar183 = vunpcklpd_avx512f(auVar184,auVar186);
              auVar184 = vunpckhpd_avx512f(auVar184,auVar186);
              auVar186 = vshuff64x2_avx512f(auVar187,auVar178,0x88);
              auVar188 = vshuff64x2_avx512f(auVar182,auVar175,0x88);
              auVar189 = vshuff64x2_avx512f(auVar179,auVar185,0x88);
              auVar190 = vshuff64x2_avx512f(auVar177,auVar181,0x88);
              auVar191 = vshuff64x2_avx512f(auVar183,auVar176,0x88);
              auVar192 = vshuff64x2_avx512f(auVar180,auVar184,0x88);
              auVar178 = vshuff64x2_avx512f(auVar187,auVar178,0xdd);
              auVar187 = vshuff64x2_avx512f(auVar182,auVar175,0xdd);
              auVar185 = vshuff64x2_avx512f(auVar179,auVar185,0xdd);
              auVar177 = vshuff64x2_avx512f(auVar177,auVar181,0xdd);
              auVar179 = vshuff64x2_avx512f(auVar183,auVar176,0xdd);
              auVar184 = vshuff64x2_avx512f(auVar180,auVar184,0xdd);
              auVar180 = vshuff64x2_avx512f(auVar186,auVar188,0x88);
              auVar181 = vshuff64x2_avx512f(auVar189,auVar190,0x88);
              auVar193 = vshuff64x2_avx512f(auVar191,auVar192,0x88);
              auVar194 = vshuff64x2_avx512f(auVar178,auVar187,0x88);
              auVar195 = vshuff64x2_avx512f(auVar185,auVar177,0x88);
              auVar196 = vshuff64x2_avx512f(auVar179,auVar184,0x88);
              auVar186 = vshuff64x2_avx512f(auVar186,auVar188,0xdd);
              auVar188 = vshuff64x2_avx512f(auVar189,auVar190,0xdd);
              auVar189 = vshuff64x2_avx512f(auVar191,auVar192,0xdd);
              auVar178 = vshuff64x2_avx512f(auVar178,auVar187,0xdd);
              auVar177 = vshuff64x2_avx512f(auVar185,auVar177,0xdd);
              auVar184 = vshuff64x2_avx512f(auVar179,auVar184,0xdd);
              *(undefined1 (*) [32])(*pauVar143 + 0x10) = auVar180._0_32_;
              *(undefined1 (*) [16])(*pauVar143 + 0x30) = auVar182._0_16_;
              *(undefined1 (*) [16])(pauVar143[1] + 0x10) = auVar175._0_16_;
              *(undefined1 (*) [32])(pauVar143[1] + 0x20) = auVar181._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar181,1);
              *(undefined1 (*) [32])(pauVar143[2] + 0x10) = auVar163;
              *(undefined1 (*) [16])(pauVar143[2] + 0x30) = auVar183._0_16_;
              *(undefined1 (*) [16])(pauVar143[3] + 0x10) = auVar176._0_16_;
              auVar163 = vextractf64x4_avx512f(auVar193,1);
              *(undefined1 (*) [32])(pauVar143[3] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[4] + 0x10) = auVar194._0_32_;
              auVar149 = vextractf32x4_avx512f(auVar182,1);
              *(undefined1 (*) [16])(pauVar143[2] + 0x18) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,1);
              *(undefined1 (*) [16])(pauVar143[2] + 0x28) = auVar149;
              *(undefined1 (*) [32])(pauVar143[5] + 0x20) = auVar195._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar195,1);
              *(undefined1 (*) [32])(pauVar143[6] + 0x10) = auVar163;
              auVar149 = vextractf32x4_avx512f(auVar183,1);
              *(undefined1 (*) [16])(pauVar143[3] + 0x18) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,1);
              *(undefined1 (*) [16])(pauVar143[3] + 0x28) = auVar149;
              auVar163 = vextractf64x4_avx512f(auVar196,1);
              *(undefined1 (*) [32])(pauVar143[7] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[8] + 0x10) = auVar186._0_32_;
              auVar149 = vextractf32x4_avx512f(auVar182,2);
              *(undefined1 (*) [16])(pauVar143[4] + 0x18) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,2);
              *(undefined1 (*) [16])(pauVar143[4] + 0x28) = auVar149;
              *(undefined1 (*) [32])(pauVar143[9] + 0x20) = auVar188._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar188,1);
              *(undefined1 (*) [32])(pauVar143[10] + 0x10) = auVar163;
              auVar149 = vextractf32x4_avx512f(auVar183,2);
              *(undefined1 (*) [16])(pauVar143[5] + 0x18) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,2);
              *(undefined1 (*) [16])(pauVar143[5] + 0x28) = auVar149;
              auVar163 = vextractf64x4_avx512f(auVar189,1);
              *(undefined1 (*) [32])(pauVar143[0xb] + 0x20) = auVar163;
              *(undefined1 (*) [32])(pauVar143[0xc] + 0x10) = auVar178._0_32_;
              auVar149 = vextractf32x4_avx512f(auVar182,3);
              *(undefined1 (*) [16])(pauVar143[6] + 0x18) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar175,3);
              *(undefined1 (*) [16])(pauVar143[6] + 0x28) = auVar149;
              *(undefined1 (*) [32])(pauVar143[0xd] + 0x20) = auVar177._0_32_;
              auVar163 = vextractf64x4_avx512f(auVar177,1);
              *(undefined1 (*) [32])(pauVar143[0xe] + 0x10) = auVar163;
              auVar149 = vextractf32x4_avx512f(auVar183,3);
              *(undefined1 (*) [16])(pauVar143[7] + 0x18) = auVar149;
              auVar149 = vextractf32x4_avx512f(auVar176,3);
              auVar163 = vextractf64x4_avx512f(auVar184,1);
              *(undefined1 (*) [32])(pauVar143[0xf] + 0x20) = auVar163;
              iVar131 = 0xc;
              lVar126 = 0x300;
            }
            *(undefined1 (*) [16])(pauVar143[0xf] + 0x10) = auVar149;
          }
          topT = (Mat *)((long)&topT->data + lVar126);
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar145 * 4);
        }
LAB_004b8bb3:
        iVar121 = iVar131 + 0xf;
        while (iVar121 < max_jj) {
          auVar178._0_8_ = topT->data;
          auVar178._8_8_ = topT->refcount;
          auVar178._16_8_ = topT->elemsize;
          auVar178._24_4_ = topT->elempack;
          auVar178._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar178._32_8_ = topT->allocator;
          auVar178._40_4_ = topT->dims;
          auVar178._44_4_ = topT->w;
          auVar178._48_4_ = topT->h;
          auVar178._52_4_ = topT->d;
          auVar178._56_4_ = topT->c;
          auVar178._60_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar179._0_8_ = topT[7].refcount;
          auVar179._8_8_ = topT[7].elemsize;
          auVar179._16_4_ = topT[7].elempack;
          auVar179._20_4_ = *(undefined4 *)&topT[7].field_0x1c;
          auVar179._24_8_ = topT[7].allocator;
          auVar179._32_4_ = topT[7].dims;
          auVar179._36_4_ = topT[7].w;
          auVar179._40_4_ = topT[7].h;
          auVar179._44_4_ = topT[7].d;
          auVar179._48_4_ = topT[7].c;
          auVar179._52_4_ = *(undefined4 *)&topT[7].field_0x3c;
          auVar179._56_8_ = topT[7].cstep;
          auVar180._0_8_ = topT[8].data;
          auVar180._8_8_ = topT[8].refcount;
          auVar180._16_8_ = topT[8].elemsize;
          auVar180._24_4_ = topT[8].elempack;
          auVar180._28_4_ = *(undefined4 *)&topT[8].field_0x1c;
          auVar180._32_8_ = topT[8].allocator;
          auVar180._40_4_ = topT[8].dims;
          auVar180._44_4_ = topT[8].w;
          auVar180._48_4_ = topT[8].h;
          auVar180._52_4_ = topT[8].d;
          auVar180._56_4_ = topT[8].c;
          auVar180._60_4_ = *(undefined4 *)&topT[8].field_0x3c;
          auVar175 = vunpcklps_avx512f(auVar178,*(undefined1 (*) [64])&topT->cstep);
          auVar176 = vunpckhps_avx512f(auVar178,*(undefined1 (*) [64])&topT->cstep);
          auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar184 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar185 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar181 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar182 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar183 = vunpcklps_avx512f(auVar179,auVar180);
          auVar179 = vunpckhps_avx512f(auVar179,auVar180);
          auVar180 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[8].cstep,
                                       *(undefined1 (*) [64])&topT[9].c);
          auVar186 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[8].cstep,
                                       *(undefined1 (*) [64])&topT[9].c);
          auVar187 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[10].h,
                                       *(undefined1 (*) [64])&topT[0xb].dims);
          auVar188 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[10].h,
                                       *(undefined1 (*) [64])&topT[0xb].dims);
          auVar189 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[0xc].allocator,
                                       *(undefined1 (*) [64])&topT[0xd].elempack);
          auVar190 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[0xc].allocator,
                                       *(undefined1 (*) [64])&topT[0xd].elempack);
          auVar191 = vunpcklpd_avx512f(auVar175,auVar177);
          auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
          auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
          auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
          auVar178 = vunpcklpd_avx512f(auVar184,auVar181);
          auVar184 = vunpckhpd_avx512f(auVar184,auVar181);
          auVar181 = vunpcklpd_avx512f(auVar185,auVar182);
          auVar185 = vunpckhpd_avx512f(auVar185,auVar182);
          auVar182 = vunpcklpd_avx512f(auVar183,auVar180);
          auVar180 = vunpckhpd_avx512f(auVar183,auVar180);
          auVar183 = vunpcklpd_avx512f(auVar179,auVar186);
          auVar179 = vunpckhpd_avx512f(auVar179,auVar186);
          auVar186 = vunpcklpd_avx512f(auVar187,auVar189);
          auVar187 = vunpckhpd_avx512f(auVar187,auVar189);
          auVar189 = vunpcklpd_avx512f(auVar188,auVar190);
          auVar188 = vunpckhpd_avx512f(auVar188,auVar190);
          auVar190 = vshuff64x2_avx512f(auVar191,auVar178,0x88);
          auVar192 = vshuff64x2_avx512f(auVar182,auVar186,0x88);
          auVar193 = vshuff64x2_avx512f(auVar175,auVar184,0x88);
          auVar194 = vshuff64x2_avx512f(auVar180,auVar187,0x88);
          auVar195 = vshuff64x2_avx512f(auVar177,auVar181,0x88);
          auVar196 = vshuff64x2_avx512f(auVar183,auVar189,0x88);
          auVar197 = vshuff64x2_avx512f(auVar176,auVar185,0x88);
          auVar198 = vshuff64x2_avx512f(auVar179,auVar188,0x88);
          auVar178 = vshuff64x2_avx512f(auVar191,auVar178,0xdd);
          auVar182 = vshuff64x2_avx512f(auVar182,auVar186,0xdd);
          auVar175 = vshuff64x2_avx512f(auVar175,auVar184,0xdd);
          auVar184 = vshuff64x2_avx512f(auVar180,auVar187,0xdd);
          auVar177 = vshuff64x2_avx512f(auVar177,auVar181,0xdd);
          auVar180 = vshuff64x2_avx512f(auVar183,auVar189,0xdd);
          auVar176 = vshuff64x2_avx512f(auVar176,auVar185,0xdd);
          auVar185 = vshuff64x2_avx512f(auVar179,auVar188,0xdd);
          auVar179 = vshuff64x2_avx512f(auVar190,auVar192,0x88);
          auVar181 = vshuff64x2_avx512f(auVar193,auVar194,0x88);
          auVar183 = vshuff64x2_avx512f(auVar195,auVar196,0x88);
          auVar186 = vshuff64x2_avx512f(auVar197,auVar198,0x88);
          auVar187 = vshuff64x2_avx512f(auVar178,auVar182,0x88);
          auVar188 = vshuff64x2_avx512f(auVar175,auVar184,0x88);
          auVar189 = vshuff64x2_avx512f(auVar177,auVar180,0x88);
          auVar191 = vshuff64x2_avx512f(auVar176,auVar185,0x88);
          auVar190 = vshuff64x2_avx512f(auVar190,auVar192,0xdd);
          auVar192 = vshuff64x2_avx512f(auVar193,auVar194,0xdd);
          auVar193 = vshuff64x2_avx512f(auVar195,auVar196,0xdd);
          auVar194 = vshuff64x2_avx512f(auVar197,auVar198,0xdd);
          auVar178 = vshuff64x2_avx512f(auVar178,auVar182,0xdd);
          auVar175 = vshuff64x2_avx512f(auVar175,auVar184,0xdd);
          auVar177 = vshuff64x2_avx512f(auVar177,auVar180,0xdd);
          auVar176 = vshuff64x2_avx512f(auVar176,auVar185,0xdd);
          *pauVar143 = auVar179;
          pauVar143[1] = auVar181;
          pauVar143[2] = auVar183;
          pauVar143[3] = auVar186;
          pauVar143[4] = auVar187;
          pauVar143[5] = auVar188;
          pauVar143[6] = auVar189;
          pauVar143[7] = auVar191;
          pauVar143[8] = auVar190;
          pauVar143[9] = auVar192;
          pauVar143[10] = auVar193;
          pauVar143[0xb] = auVar194;
          pauVar143[0xc] = auVar178;
          pauVar143[0xd] = auVar175;
          pauVar143[0xe] = auVar177;
          pauVar143[0xf] = auVar176;
          topT = (Mat *)&topT[0xe].elemsize;
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar142);
          iVar121 = iVar131 + 0x1f;
          iVar131 = iVar131 + 0x10;
        }
        iVar121 = iVar131 + 0xb;
        while (iVar121 < max_jj) {
          auVar181._0_8_ = topT->data;
          auVar181._8_8_ = topT->refcount;
          auVar181._16_8_ = topT->elemsize;
          auVar181._24_4_ = topT->elempack;
          auVar181._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar181._32_8_ = topT->allocator;
          auVar181._40_4_ = topT->dims;
          auVar181._44_4_ = topT->w;
          auVar181._48_4_ = topT->h;
          auVar181._52_4_ = topT->d;
          auVar181._56_4_ = topT->c;
          auVar181._60_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar182._0_8_ = topT[7].refcount;
          auVar182._8_8_ = topT[7].elemsize;
          auVar182._16_4_ = topT[7].elempack;
          auVar182._20_4_ = *(undefined4 *)&topT[7].field_0x1c;
          auVar182._24_8_ = topT[7].allocator;
          auVar182._32_4_ = topT[7].dims;
          auVar182._36_4_ = topT[7].w;
          auVar182._40_4_ = topT[7].h;
          auVar182._44_4_ = topT[7].d;
          auVar182._48_4_ = topT[7].c;
          auVar182._52_4_ = *(undefined4 *)&topT[7].field_0x3c;
          auVar182._56_8_ = topT[7].cstep;
          auVar183._0_8_ = topT[8].data;
          auVar183._8_8_ = topT[8].refcount;
          auVar183._16_8_ = topT[8].elemsize;
          auVar183._24_4_ = topT[8].elempack;
          auVar183._28_4_ = *(undefined4 *)&topT[8].field_0x1c;
          auVar183._32_8_ = topT[8].allocator;
          auVar183._40_4_ = topT[8].dims;
          auVar183._44_4_ = topT[8].w;
          auVar183._48_4_ = topT[8].h;
          auVar183._52_4_ = topT[8].d;
          auVar183._56_4_ = topT[8].c;
          auVar183._60_4_ = *(undefined4 *)&topT[8].field_0x3c;
          auVar175 = vunpcklps_avx512f(auVar181,*(undefined1 (*) [64])&topT->cstep);
          auVar176 = vunpckhps_avx512f(auVar181,*(undefined1 (*) [64])&topT->cstep);
          auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar184 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar185 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar179 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar180 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar181 = vunpcklps_avx512f(auVar182,auVar183);
          auVar182 = vunpckhps_avx512f(auVar182,auVar183);
          auVar183 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[8].cstep,
                                       *(undefined1 (*) [64])&topT[9].c);
          auVar186 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[8].cstep,
                                       *(undefined1 (*) [64])&topT[9].c);
          auVar187 = vunpcklpd_avx512f(auVar175,auVar177);
          auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
          auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
          auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
          auVar178 = vunpcklpd_avx512f(auVar184,auVar179);
          auVar184 = vunpckhpd_avx512f(auVar184,auVar179);
          auVar179 = vunpcklpd_avx512f(auVar185,auVar180);
          auVar185 = vunpckhpd_avx512f(auVar185,auVar180);
          auVar180 = vunpcklpd_avx512f(auVar181,auVar183);
          auVar181 = vunpckhpd_avx512f(auVar181,auVar183);
          auVar183 = vunpcklpd_avx512f(auVar182,auVar186);
          auVar182 = vunpckhpd_avx512f(auVar182,auVar186);
          auVar186 = vshuff64x2_avx512f(auVar187,auVar178,0x88);
          auVar188 = vshuff64x2_avx512f(auVar180,auVar175,0x88);
          auVar189 = vshuff64x2_avx512f(auVar184,auVar181,0x88);
          auVar190 = vshuff64x2_avx512f(auVar177,auVar179,0x88);
          auVar191 = vshuff64x2_avx512f(auVar183,auVar176,0x88);
          auVar192 = vshuff64x2_avx512f(auVar185,auVar182,0x88);
          auVar178 = vshuff64x2_avx512f(auVar187,auVar178,0xdd);
          auVar187 = vshuff64x2_avx512f(auVar180,auVar175,0xdd);
          auVar184 = vshuff64x2_avx512f(auVar184,auVar181,0xdd);
          auVar177 = vshuff64x2_avx512f(auVar177,auVar179,0xdd);
          auVar179 = vshuff64x2_avx512f(auVar183,auVar176,0xdd);
          auVar185 = vshuff64x2_avx512f(auVar185,auVar182,0xdd);
          auVar181 = vshuff64x2_avx512f(auVar186,auVar188,0x88);
          auVar182 = vshuff64x2_avx512f(auVar189,auVar190,0x88);
          auVar193 = vshuff64x2_avx512f(auVar191,auVar192,0x88);
          auVar194 = vshuff64x2_avx512f(auVar178,auVar187,0x88);
          auVar195 = vshuff64x2_avx512f(auVar184,auVar177,0x88);
          auVar196 = vshuff64x2_avx512f(auVar179,auVar185,0x88);
          auVar186 = vshuff64x2_avx512f(auVar186,auVar188,0xdd);
          auVar188 = vshuff64x2_avx512f(auVar189,auVar190,0xdd);
          auVar189 = vshuff64x2_avx512f(auVar191,auVar192,0xdd);
          auVar178 = vshuff64x2_avx512f(auVar178,auVar187,0xdd);
          auVar177 = vshuff64x2_avx512f(auVar184,auVar177,0xdd);
          auVar184 = vshuff64x2_avx512f(auVar179,auVar185,0xdd);
          *(undefined1 (*) [32])*pauVar143 = auVar181._0_32_;
          *(undefined1 (*) [16])(*pauVar143 + 0x20) = auVar180._0_16_;
          *(undefined1 (*) [16])pauVar143[1] = auVar175._0_16_;
          *(undefined1 (*) [32])(pauVar143[1] + 0x10) = auVar182._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar182,1);
          *(undefined1 (*) [32])pauVar143[2] = auVar163;
          *(undefined1 (*) [16])(pauVar143[2] + 0x20) = auVar183._0_16_;
          *(undefined1 (*) [16])pauVar143[3] = auVar176._0_16_;
          auVar163 = vextractf64x4_avx512f(auVar193,1);
          *(undefined1 (*) [32])(pauVar143[3] + 0x10) = auVar163;
          *(undefined1 (*) [32])pauVar143[4] = auVar194._0_32_;
          auVar149 = vextractf32x4_avx512f(auVar180,1);
          *(undefined1 (*) [16])(pauVar143[2] + 0x10) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,1);
          *(undefined1 (*) [16])(pauVar143[2] + 0x20) = auVar149;
          *(undefined1 (*) [32])(pauVar143[5] + 0x10) = auVar195._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar195,1);
          *(undefined1 (*) [32])pauVar143[6] = auVar163;
          auVar149 = vextractf32x4_avx512f(auVar183,1);
          *(undefined1 (*) [16])(pauVar143[3] + 0x10) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,1);
          *(undefined1 (*) [16])(pauVar143[3] + 0x20) = auVar149;
          auVar163 = vextractf64x4_avx512f(auVar196,1);
          *(undefined1 (*) [32])(pauVar143[7] + 0x10) = auVar163;
          *(undefined1 (*) [32])pauVar143[8] = auVar186._0_32_;
          auVar149 = vextractf32x4_avx512f(auVar180,2);
          *(undefined1 (*) [16])(pauVar143[4] + 0x10) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,2);
          *(undefined1 (*) [16])(pauVar143[4] + 0x20) = auVar149;
          *(undefined1 (*) [32])(pauVar143[9] + 0x10) = auVar188._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar188,1);
          *(undefined1 (*) [32])pauVar143[10] = auVar163;
          auVar149 = vextractf32x4_avx512f(auVar183,2);
          *(undefined1 (*) [16])(pauVar143[5] + 0x10) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,2);
          *(undefined1 (*) [16])(pauVar143[5] + 0x20) = auVar149;
          auVar163 = vextractf64x4_avx512f(auVar189,1);
          *(undefined1 (*) [32])(pauVar143[0xb] + 0x10) = auVar163;
          *(undefined1 (*) [32])pauVar143[0xc] = auVar178._0_32_;
          auVar149 = vextractf32x4_avx512f(auVar180,3);
          *(undefined1 (*) [16])(pauVar143[6] + 0x10) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,3);
          *(undefined1 (*) [16])(pauVar143[6] + 0x20) = auVar149;
          *(undefined1 (*) [32])(pauVar143[0xd] + 0x10) = auVar177._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar177,1);
          *(undefined1 (*) [32])pauVar143[0xe] = auVar163;
          auVar149 = vextractf32x4_avx512f(auVar183,3);
          *(undefined1 (*) [16])(pauVar143[7] + 0x10) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,3);
          *(undefined1 (*) [16])(pauVar143[7] + 0x20) = auVar149;
          auVar163 = vextractf64x4_avx512f(auVar184,1);
          *(undefined1 (*) [32])(pauVar143[0xf] + 0x10) = auVar163;
          topT = (Mat *)&topT[10].h;
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar142);
          iVar121 = iVar131 + 0x17;
          iVar131 = iVar131 + 0xc;
        }
        iVar121 = iVar131 + 7;
        while (iVar121 < max_jj) {
          auVar186._0_8_ = topT->data;
          auVar186._8_8_ = topT->refcount;
          auVar186._16_8_ = topT->elemsize;
          auVar186._24_4_ = topT->elempack;
          auVar186._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar186._32_8_ = topT->allocator;
          auVar186._40_4_ = topT->dims;
          auVar186._44_4_ = topT->w;
          auVar186._48_4_ = topT->h;
          auVar186._52_4_ = topT->d;
          auVar186._56_4_ = topT->c;
          auVar186._60_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar175 = vunpcklps_avx512f(auVar186,*(undefined1 (*) [64])&topT->cstep);
          auVar176 = vunpckhps_avx512f(auVar186,*(undefined1 (*) [64])&topT->cstep);
          auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar184 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar185 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar179 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar180 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar181 = vunpcklpd_avx512f(auVar175,auVar177);
          auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
          auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
          auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
          auVar178 = vunpcklpd_avx512f(auVar184,auVar179);
          auVar184 = vunpckhpd_avx512f(auVar184,auVar179);
          auVar179 = vunpcklpd_avx512f(auVar185,auVar180);
          auVar185 = vunpckhpd_avx512f(auVar185,auVar180);
          auVar180 = vshuff64x2_avx512f(auVar181,auVar178,0x88);
          auVar182 = vshuff64x2_avx512f(auVar175,auVar184,0x88);
          auVar183 = vshuff64x2_avx512f(auVar177,auVar179,0x88);
          auVar186 = vshuff64x2_avx512f(auVar176,auVar185,0x88);
          auVar178 = vshuff64x2_avx512f(auVar181,auVar178,0xdd);
          auVar175 = vshuff64x2_avx512f(auVar175,auVar184,0xdd);
          auVar177 = vshuff64x2_avx512f(auVar177,auVar179,0xdd);
          auVar176 = vshuff64x2_avx512f(auVar176,auVar185,0xdd);
          auVar184 = vshuff64x2_avx512f(auVar180,auVar182,0x88);
          auVar185 = vshuff64x2_avx512f(auVar183,auVar186,0x88);
          auVar179 = vshuff64x2_avx512f(auVar178,auVar175,0x88);
          auVar181 = vshuff64x2_avx512f(auVar177,auVar176,0x88);
          auVar180 = vshuff64x2_avx512f(auVar180,auVar182,0xdd);
          auVar182 = vshuff64x2_avx512f(auVar183,auVar186,0xdd);
          auVar175 = vshuff64x2_avx512f(auVar178,auVar175,0xdd);
          auVar176 = vshuff64x2_avx512f(auVar177,auVar176,0xdd);
          *(undefined1 (*) [32])*pauVar143 = auVar184._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar184,1);
          *(undefined1 (*) [32])pauVar143[1] = auVar163;
          *(undefined1 (*) [32])pauVar143[2] = auVar185._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar185,1);
          *(undefined1 (*) [32])pauVar143[3] = auVar163;
          *(undefined1 (*) [32])pauVar143[4] = auVar179._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar179,1);
          *(undefined1 (*) [32])pauVar143[5] = auVar163;
          *(undefined1 (*) [32])pauVar143[6] = auVar181._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar181,1);
          *(undefined1 (*) [32])pauVar143[7] = auVar163;
          *(undefined1 (*) [32])pauVar143[8] = auVar180._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar180,1);
          *(undefined1 (*) [32])pauVar143[9] = auVar163;
          *(undefined1 (*) [32])pauVar143[10] = auVar182._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar182,1);
          *(undefined1 (*) [32])pauVar143[0xb] = auVar163;
          *(undefined1 (*) [32])pauVar143[0xc] = auVar175._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar175,1);
          *(undefined1 (*) [32])pauVar143[0xd] = auVar163;
          *(undefined1 (*) [32])pauVar143[0xe] = auVar176._0_32_;
          auVar163 = vextractf64x4_avx512f(auVar176,1);
          *(undefined1 (*) [32])pauVar143[0xf] = auVar163;
          topT = (Mat *)&topT[7].refcount;
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar142);
          iVar121 = iVar131 + 0xf;
          iVar131 = iVar131 + 8;
        }
        iVar131 = iVar131 + 3;
        if (iVar131 < max_jj) {
          pauVar143 = pauVar143 + 0xf;
          do {
            auVar187._0_8_ = topT->data;
            auVar187._8_8_ = topT->refcount;
            auVar187._16_8_ = topT->elemsize;
            auVar187._24_4_ = topT->elempack;
            auVar187._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar187._32_8_ = topT->allocator;
            auVar187._40_4_ = topT->dims;
            auVar187._44_4_ = topT->w;
            auVar187._48_4_ = topT->h;
            auVar187._52_4_ = topT->d;
            auVar187._56_4_ = topT->c;
            auVar187._60_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar175 = vunpcklps_avx512f(auVar187,*(undefined1 (*) [64])&topT->cstep);
            auVar176 = vunpckhps_avx512f(auVar187,*(undefined1 (*) [64])&topT->cstep);
            auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar184 = vunpcklpd_avx512f(auVar175,auVar177);
            auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
            auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
            auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
            *(undefined1 (*) [16])pauVar143[-0xf] = auVar184._0_16_;
            *(undefined1 (*) [16])pauVar143[-0xe] = auVar175._0_16_;
            *(undefined1 (*) [16])pauVar143[-0xd] = auVar177._0_16_;
            *(undefined1 (*) [16])pauVar143[-0xc] = auVar176._0_16_;
            auVar149 = vextractf32x4_avx512f(auVar184,1);
            *(undefined1 (*) [16])(pauVar143[-6] + 0x20) = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar175,1);
            *(undefined1 (*) [16])pauVar143[-5] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar177,1);
            *(undefined1 (*) [16])(pauVar143[-5] + 0x20) = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar176,1);
            *(undefined1 (*) [16])pauVar143[-4] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar184,2);
            *(undefined1 (*) [16])(pauVar143[-4] + 0x20) = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar175,2);
            *(undefined1 (*) [16])pauVar143[-3] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar177,2);
            *(undefined1 (*) [16])(pauVar143[-3] + 0x20) = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar176,2);
            *(undefined1 (*) [16])pauVar143[-2] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar184,3);
            *(undefined1 (*) [16])(pauVar143[-2] + 0x20) = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar175,3);
            *(undefined1 (*) [16])pauVar143[-1] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar177,3);
            *(undefined1 (*) [16])(pauVar143[-1] + 0x20) = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar176,3);
            *(undefined1 (*) [16])*pauVar143 = auVar149;
            topT = (Mat *)&topT[3].dims;
            pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar142);
            iVar131 = iVar131 + 4;
          } while (iVar131 < max_jj);
        }
      }
      if (iVar101 == 8) {
        pauVar143 = (undefined1 (*) [64])
                    ((long)top_blob->data +
                    (uVar135 + lVar147) * 0x20 + (long)(int)((uVar130 >> 3) * iVar138) * 4);
        uVar122 = 0;
        if ((j & 0x80000007U) == 4) {
          auVar188._0_8_ = topT->data;
          auVar188._8_8_ = topT->refcount;
          auVar188._16_8_ = topT->elemsize;
          auVar188._24_4_ = topT->elempack;
          auVar188._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar188._32_8_ = topT->allocator;
          auVar188._40_4_ = topT->dims;
          auVar188._44_4_ = topT->w;
          auVar188._48_4_ = topT->h;
          auVar188._52_4_ = topT->d;
          auVar188._56_4_ = topT->c;
          auVar188._60_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar175 = vunpcklps_avx512f(auVar188,*(undefined1 (*) [64])&topT->cstep);
          auVar176 = vunpckhps_avx512f(auVar188,*(undefined1 (*) [64])&topT->cstep);
          auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar184 = vunpcklpd_avx512f(auVar175,auVar177);
          auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
          auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
          auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
          *(undefined1 (*) [16])(*pauVar143 + 0x10) = auVar184._0_16_;
          *(undefined1 (*) [16])(*pauVar143 + 0x30) = auVar175._0_16_;
          *(undefined1 (*) [16])(pauVar143[1] + 0x10) = auVar177._0_16_;
          *(undefined1 (*) [16])(pauVar143[1] + 0x30) = auVar176._0_16_;
          auVar149 = vextractf32x4_avx512f(auVar184,1);
          *(undefined1 (*) [16])(pauVar143[1] + 8) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,1);
          *(undefined1 (*) [16])(pauVar143[1] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar177,1);
          *(undefined1 (*) [16])(pauVar143[1] + 0x28) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,1);
          *(undefined1 (*) [16])(pauVar143[1] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar184,2);
          *(undefined1 (*) [16])(pauVar143[2] + 8) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,2);
          *(undefined1 (*) [16])(pauVar143[2] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar177,2);
          *(undefined1 (*) [16])(pauVar143[2] + 0x28) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,2);
          *(undefined1 (*) [16])(pauVar143[2] + 0x38) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar184,3);
          *(undefined1 (*) [16])(pauVar143[3] + 8) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar175,3);
          *(undefined1 (*) [16])(pauVar143[3] + 0x18) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar177,3);
          *(undefined1 (*) [16])(pauVar143[3] + 0x28) = auVar149;
          auVar149 = vextractf32x4_avx512f(auVar176,3);
          *(undefined1 (*) [16])(pauVar143[3] + 0x38) = auVar149;
          topT = (Mat *)&topT[3].dims;
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + (long)iVar138 * 4);
          uVar122 = 4;
        }
        iVar131 = uVar122 + 7;
        while (iVar131 < max_jj) {
          auVar189._0_8_ = topT->data;
          auVar189._8_8_ = topT->refcount;
          auVar189._16_8_ = topT->elemsize;
          auVar189._24_4_ = topT->elempack;
          auVar189._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar189._32_8_ = topT->allocator;
          auVar189._40_4_ = topT->dims;
          auVar189._44_4_ = topT->w;
          auVar189._48_4_ = topT->h;
          auVar189._52_4_ = topT->d;
          auVar189._56_4_ = topT->c;
          auVar189._60_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar175 = vunpcklps_avx512f(auVar189,*(undefined1 (*) [64])&topT->cstep);
          auVar176 = vunpckhps_avx512f(auVar189,*(undefined1 (*) [64])&topT->cstep);
          auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                       *(undefined1 (*) [64])&topT[2].h);
          auVar184 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar185 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[3].dims,
                                       *(undefined1 (*) [64])&topT[4].allocator);
          auVar179 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar180 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[5].elempack,
                                       *(undefined1 (*) [64])&topT[6].elemsize);
          auVar181 = vunpcklpd_avx512f(auVar175,auVar177);
          auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
          auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
          auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
          auVar178 = vunpcklpd_avx512f(auVar184,auVar179);
          auVar184 = vunpckhpd_avx512f(auVar184,auVar179);
          auVar179 = vunpcklpd_avx512f(auVar185,auVar180);
          auVar185 = vunpckhpd_avx512f(auVar185,auVar180);
          auVar180 = vshuff64x2_avx512f(auVar181,auVar178,0x88);
          auVar182 = vshuff64x2_avx512f(auVar175,auVar184,0x88);
          auVar183 = vshuff64x2_avx512f(auVar177,auVar179,0x88);
          auVar186 = vshuff64x2_avx512f(auVar176,auVar185,0x88);
          auVar178 = vshuff64x2_avx512f(auVar181,auVar178,0xdd);
          auVar175 = vshuff64x2_avx512f(auVar175,auVar184,0xdd);
          auVar177 = vshuff64x2_avx512f(auVar177,auVar179,0xdd);
          auVar176 = vshuff64x2_avx512f(auVar176,auVar185,0xdd);
          auVar184 = vshuff64x2_avx512f(auVar180,auVar182,0x88);
          auVar185 = vshuff64x2_avx512f(auVar183,auVar186,0x88);
          auVar179 = vshuff64x2_avx512f(auVar178,auVar175,0x88);
          auVar181 = vshuff64x2_avx512f(auVar177,auVar176,0x88);
          auVar180 = vshuff64x2_avx512f(auVar180,auVar182,0xdd);
          auVar182 = vshuff64x2_avx512f(auVar183,auVar186,0xdd);
          auVar175 = vshuff64x2_avx512f(auVar178,auVar175,0xdd);
          auVar176 = vshuff64x2_avx512f(auVar177,auVar176,0xdd);
          *pauVar143 = auVar184;
          pauVar143[1] = auVar185;
          pauVar143[2] = auVar179;
          pauVar143[3] = auVar181;
          pauVar143[4] = auVar180;
          pauVar143[5] = auVar182;
          pauVar143[6] = auVar175;
          pauVar143[7] = auVar176;
          topT = (Mat *)&topT[7].refcount;
          pauVar143 = (undefined1 (*) [64])(*pauVar143 + lVar144);
          iVar131 = uVar122 + 0xf;
          uVar122 = uVar122 + 8;
        }
        uVar122 = uVar122 | 3;
        if ((int)uVar122 < max_jj) {
          pauVar134 = (undefined1 (*) [16])(pauVar143[7] + 0x20);
          do {
            auVar190._0_8_ = topT->data;
            auVar190._8_8_ = topT->refcount;
            auVar190._16_8_ = topT->elemsize;
            auVar190._24_4_ = topT->elempack;
            auVar190._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar190._32_8_ = topT->allocator;
            auVar190._40_4_ = topT->dims;
            auVar190._44_4_ = topT->w;
            auVar190._48_4_ = topT->h;
            auVar190._52_4_ = topT->d;
            auVar190._56_4_ = topT->c;
            auVar190._60_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar175 = vunpcklps_avx512f(auVar190,*(undefined1 (*) [64])&topT->cstep);
            auVar176 = vunpckhps_avx512f(auVar190,*(undefined1 (*) [64])&topT->cstep);
            auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar184 = vunpcklpd_avx512f(auVar175,auVar177);
            auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
            auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
            auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
            pauVar134[-0x1e] = auVar184._0_16_;
            pauVar134[-0x1c] = auVar175._0_16_;
            pauVar134[-0x1a] = auVar177._0_16_;
            pauVar134[-0x18] = auVar176._0_16_;
            auVar149 = vextractf32x4_avx512f(auVar184,1);
            pauVar134[-0xb] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar175,1);
            pauVar134[-10] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar177,1);
            pauVar134[-9] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar176,1);
            pauVar134[-8] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar184,2);
            pauVar134[-7] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar175,2);
            pauVar134[-6] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar177,2);
            pauVar134[-5] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar176,2);
            pauVar134[-4] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar184,3);
            pauVar134[-3] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar175,3);
            pauVar134[-2] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar177,3);
            pauVar134[-1] = auVar149;
            auVar149 = vextractf32x4_avx512f(auVar176,3);
            *pauVar134 = auVar149;
            topT = (Mat *)&topT[3].dims;
            pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar144);
            uVar122 = uVar122 + 4;
          } while ((int)uVar122 < max_jj);
        }
      }
      if (iVar101 == 4) {
        if (3 < max_jj) {
          pauVar143 = (undefined1 (*) [64])((long)top_blob->data + lVar141);
          iVar131 = 3;
          do {
            auVar191._0_8_ = topT->data;
            auVar191._8_8_ = topT->refcount;
            auVar191._16_8_ = topT->elemsize;
            auVar191._24_4_ = topT->elempack;
            auVar191._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar191._32_8_ = topT->allocator;
            auVar191._40_4_ = topT->dims;
            auVar191._44_4_ = topT->w;
            auVar191._48_4_ = topT->h;
            auVar191._52_4_ = topT->d;
            auVar191._56_4_ = topT->c;
            auVar191._60_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar175 = vunpcklps_avx512f(auVar191,*(undefined1 (*) [64])&topT->cstep);
            auVar176 = vunpckhps_avx512f(auVar191,*(undefined1 (*) [64])&topT->cstep);
            auVar177 = vunpcklps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar178 = vunpckhps_avx512f(*(undefined1 (*) [64])&topT[1].c,
                                         *(undefined1 (*) [64])&topT[2].h);
            auVar184 = vunpcklpd_avx512f(auVar175,auVar177);
            auVar175 = vunpckhpd_avx512f(auVar175,auVar177);
            auVar177 = vunpcklpd_avx512f(auVar176,auVar178);
            auVar176 = vunpckhpd_avx512f(auVar176,auVar178);
            auVar178 = vshuff64x2_avx512f(auVar184,auVar175,0x88);
            auVar185 = vshuff64x2_avx512f(auVar177,auVar176,0x88);
            auVar175 = vshuff64x2_avx512f(auVar184,auVar175,0xdd);
            auVar176 = vshuff64x2_avx512f(auVar177,auVar176,0xdd);
            auVar177 = vshuff64x2_avx512f(auVar178,auVar185,0x88);
            auVar184 = vshuff64x2_avx512f(auVar175,auVar176,0x88);
            auVar178 = vshuff64x2_avx512f(auVar178,auVar185,0xdd);
            auVar175 = vshuff64x2_avx512f(auVar175,auVar176,0xdd);
            pauVar143[-3] = auVar177;
            pauVar143[-2] = auVar184;
            pauVar143[-1] = auVar178;
            *pauVar143 = auVar175;
            topT = (Mat *)&topT[3].dims;
            pauVar143 = (undefined1 (*) [64])(*pauVar143 + (long)(iVar102 * 4) * 4);
            iVar131 = iVar131 + 4;
          } while (iVar131 < max_jj);
          goto LAB_004b9874;
        }
      }
      else {
LAB_004b9874:
        if (0 < max_jj && iVar101 == 1) {
          pauVar143 = (undefined1 (*) [64])((long)top_blob->data + lVar148);
          iVar131 = max_jj;
          do {
            *pauVar143 = *(undefined1 (*) [64])topT;
            topT = (Mat *)&topT->cstep;
            pauVar143 = (undefined1 (*) [64])(*pauVar143 + (long)iVar102 * 4);
            iVar131 = iVar131 + -1;
          } while (iVar131 != 0);
        }
      }
      uVar132 = uVar135 + 0x10;
      uVar127 = uVar135 + 0x1f;
      lVar141 = lVar141 + 0x100;
      lVar148 = lVar148 + 0x40;
      uVar135 = uVar132;
    } while (uVar127 < (uint)max_ii);
  }
  if ((int)((uint)uVar132 | 7) < max_ii) {
    iVar123 = iVar102 * 8;
    uVar122 = j + 7;
    uVar130 = j + 0xf;
    if (-1 < j) {
      uVar122 = j;
      uVar130 = j;
    }
    iVar129 = j - (uVar130 & 0xfffffff0);
    lVar145 = (long)(iVar102 * 0x10);
    uVar135 = uVar132 & 0xffffffff;
    lVar147 = (long)i;
    lVar142 = lVar145 * 4;
    lVar144 = (long)iVar123 * 4;
    lVar141 = (lVar147 + uVar135) * 0x10 + (long)(iVar102 * j) * 4 + 0x60;
    lVar148 = (long)(iVar102 * j) * 4 + lVar147 * 4 + uVar135 * 4;
    do {
      if (iVar101 == 0x10) {
        pauVar133 = (undefined1 (*) [32])
                    ((long)top_blob->data +
                    (uVar135 + lVar147) * 0x40 + (long)(((int)uVar130 >> 4) * iVar102 * 0x10) * 4);
        if (iVar129 == 0xc) {
          auVar163._0_8_ = topT->data;
          auVar163._8_8_ = topT->refcount;
          auVar163._16_8_ = topT->elemsize;
          auVar163._24_4_ = topT->elempack;
          auVar163._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar106._0_8_ = topT->allocator;
          auVar106._8_4_ = topT->dims;
          auVar106._12_4_ = topT->w;
          auVar106._16_4_ = topT->h;
          auVar106._20_4_ = topT->d;
          auVar106._24_4_ = topT->c;
          auVar106._28_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar112._0_4_ = topT[1].elempack;
          auVar112._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar112._8_8_ = topT[1].allocator;
          auVar112._16_4_ = topT[1].dims;
          auVar112._20_4_ = topT[1].w;
          auVar112._24_4_ = topT[1].h;
          auVar112._28_4_ = topT[1].d;
          auVar107 = vunpcklps_avx(auVar163,auVar106);
          auVar106 = vunpckhps_avx(auVar163,auVar106);
          auVar163 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar112);
          auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar112);
          auVar113 = vunpcklpd_avx(auVar107,auVar163);
          auVar163 = vunpckhpd_avx(auVar107,auVar163);
          auVar107 = vunpcklpd_avx(auVar106,auVar112);
          auVar106 = vunpckhpd_avx(auVar106,auVar112);
          *(undefined1 (*) [16])(pauVar133[1] + 0x10) = auVar113._0_16_;
          *(undefined1 (*) [16])(pauVar133[3] + 0x10) = auVar163._0_16_;
          *(undefined1 (*) [16])(pauVar133[5] + 0x10) = auVar107._0_16_;
          *(undefined1 (*) [16])(pauVar133[7] + 0x10) = auVar106._0_16_;
          *(undefined1 (*) [16])(pauVar133[9] + 0x10) = auVar113._16_16_;
          *(undefined1 (*) [16])(pauVar133[0xb] + 0x10) = auVar163._16_16_;
          *(undefined1 (*) [16])(pauVar133[0xd] + 0x10) = auVar107._16_16_;
          *(undefined1 (*) [16])(pauVar133[0xf] + 0x10) = auVar106._16_16_;
          topT = (Mat *)&topT[1].c;
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar145 * 4);
          iVar138 = 4;
        }
        else {
          if (iVar129 == 8) {
            auVar113._0_8_ = topT->data;
            auVar113._8_8_ = topT->refcount;
            auVar113._16_8_ = topT->elemsize;
            auVar113._24_4_ = topT->elempack;
            auVar113._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar107._0_8_ = topT->allocator;
            auVar107._8_4_ = topT->dims;
            auVar107._12_4_ = topT->w;
            auVar107._16_4_ = topT->h;
            auVar107._20_4_ = topT->d;
            auVar107._24_4_ = topT->c;
            auVar107._28_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar108._0_4_ = topT[1].elempack;
            auVar108._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
            auVar108._8_8_ = topT[1].allocator;
            auVar108._16_4_ = topT[1].dims;
            auVar108._20_4_ = topT[1].w;
            auVar108._24_4_ = topT[1].h;
            auVar108._28_4_ = topT[1].d;
            auVar112 = vunpcklps_avx(auVar113,auVar107);
            auVar163 = vunpckhps_avx(auVar113,auVar107);
            auVar113 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar108);
            auVar106 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar108);
            if (max_jj < 5) {
              auVar107 = vunpcklpd_avx(auVar112,auVar113);
              auVar112 = vunpckhpd_avx(auVar112,auVar113);
              auVar113 = vunpcklpd_avx(auVar163,auVar106);
              auVar163 = vunpckhpd_avx(auVar163,auVar106);
              *(undefined1 (*) [16])pauVar133[1] = auVar107._0_16_;
              *(undefined1 (*) [16])pauVar133[3] = auVar112._0_16_;
              *(undefined1 (*) [16])pauVar133[5] = auVar113._0_16_;
              *(undefined1 (*) [16])pauVar133[7] = auVar163._0_16_;
              *(undefined1 (*) [16])pauVar133[9] = auVar107._16_16_;
              *(undefined1 (*) [16])pauVar133[0xb] = auVar112._16_16_;
              *(undefined1 (*) [16])pauVar133[0xd] = auVar113._16_16_;
              *(undefined1 (*) [16])pauVar133[0xf] = auVar163._16_16_;
              iVar138 = 4;
              lVar126 = 0x80;
            }
            else {
              auVar109._0_8_ = topT[2].elemsize;
              auVar109._8_4_ = topT[2].elempack;
              auVar109._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
              auVar109._16_8_ = topT[2].allocator;
              auVar109._24_4_ = topT[2].dims;
              auVar109._28_4_ = topT[2].w;
              auVar110._0_8_ = topT[3].refcount;
              auVar110._8_8_ = topT[3].elemsize;
              auVar110._16_4_ = topT[3].elempack;
              auVar110._20_4_ = *(undefined4 *)&topT[3].field_0x1c;
              auVar110._24_8_ = topT[3].allocator;
              auVar174 = vunpcklps_avx(*(undefined1 (*) [32])&topT[1].c,auVar109);
              auVar107 = vunpckhps_avx(*(undefined1 (*) [32])&topT[1].c,auVar109);
              auVar201 = vunpcklps_avx(*(undefined1 (*) [32])&topT[2].h,auVar110);
              auVar108 = vunpckhps_avx(*(undefined1 (*) [32])&topT[2].h,auVar110);
              auVar109 = vunpcklpd_avx(auVar112,auVar113);
              auVar112 = vunpckhpd_avx(auVar112,auVar113);
              auVar110 = vunpcklpd_avx(auVar163,auVar106);
              auVar163 = vunpckhpd_avx(auVar163,auVar106);
              auVar111 = vunpcklpd_avx(auVar174,auVar201);
              auVar106 = vunpckhpd_avx(auVar174,auVar201);
              auVar174 = vunpcklpd_avx(auVar107,auVar108);
              auVar113 = vunpckhpd_avx(auVar107,auVar108);
              auVar201._16_16_ = auVar111._0_16_;
              auVar201._0_16_ = auVar109._0_16_;
              auVar204._16_16_ = auVar106._0_16_;
              auVar204._0_16_ = auVar112._0_16_;
              auVar207._16_16_ = auVar174._0_16_;
              auVar207._0_16_ = auVar110._0_16_;
              auVar211._16_16_ = auVar113._0_16_;
              auVar211._0_16_ = auVar163._0_16_;
              auVar107 = vperm2f128_avx(auVar109,auVar111,0x31);
              auVar106 = vperm2f128_avx(auVar112,auVar106,0x31);
              auVar112 = vperm2f128_avx(auVar110,auVar174,0x31);
              auVar163 = vperm2f128_avx(auVar163,auVar113,0x31);
              pauVar133[1] = auVar201;
              pauVar133[3] = auVar204;
              pauVar133[5] = auVar207;
              pauVar133[7] = auVar211;
              pauVar133[9] = auVar107;
              pauVar133[0xb] = auVar106;
              pauVar133[0xd] = auVar112;
              pauVar133[0xf] = auVar163;
              iVar138 = 8;
              lVar126 = 0x100;
            }
          }
          else {
            iVar138 = 0;
            if (iVar129 != 4) goto LAB_004b9dec;
            auVar111._0_8_ = topT->data;
            auVar111._8_8_ = topT->refcount;
            auVar111._16_8_ = topT->elemsize;
            auVar111._24_4_ = topT->elempack;
            auVar111._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar174._0_8_ = topT->allocator;
            auVar174._8_4_ = topT->dims;
            auVar174._12_4_ = topT->w;
            auVar174._16_4_ = topT->h;
            auVar174._20_4_ = topT->d;
            auVar174._24_4_ = topT->c;
            auVar174._28_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar167._0_4_ = topT[1].elempack;
            auVar167._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
            auVar167._8_8_ = topT[1].allocator;
            auVar167._16_4_ = topT[1].dims;
            auVar167._20_4_ = topT[1].w;
            auVar167._24_4_ = topT[1].h;
            auVar167._28_4_ = topT[1].d;
            auVar112 = vunpcklps_avx(auVar111,auVar174);
            auVar163 = vunpckhps_avx(auVar111,auVar174);
            auVar113 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar167);
            auVar106 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar167);
            if (max_jj < 5) {
              auVar107 = vunpcklpd_avx(auVar112,auVar113);
              auVar112 = vunpckhpd_avx(auVar112,auVar113);
              auVar113 = vunpcklpd_avx(auVar163,auVar106);
              auVar163 = vunpckhpd_avx(auVar163,auVar106);
              *(undefined1 (*) [16])(*pauVar133 + 0x10) = auVar107._0_16_;
              *(undefined1 (*) [16])(pauVar133[2] + 0x10) = auVar112._0_16_;
              *(undefined1 (*) [16])(pauVar133[4] + 0x10) = auVar113._0_16_;
              *(undefined1 (*) [16])(pauVar133[6] + 0x10) = auVar163._0_16_;
              *(undefined1 (*) [16])(pauVar133[8] + 0x10) = auVar107._16_16_;
              *(undefined1 (*) [16])(pauVar133[10] + 0x10) = auVar112._16_16_;
              *(undefined1 (*) [16])(pauVar133[0xc] + 0x10) = auVar113._16_16_;
              auVar149 = auVar163._16_16_;
              iVar138 = 4;
              lVar126 = 0x80;
            }
            else {
              auVar164._0_8_ = topT[2].elemsize;
              auVar164._8_4_ = topT[2].elempack;
              auVar164._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
              auVar164._16_8_ = topT[2].allocator;
              auVar164._24_4_ = topT[2].dims;
              auVar164._28_4_ = topT[2].w;
              auVar165._0_8_ = topT[3].refcount;
              auVar165._8_8_ = topT[3].elemsize;
              auVar165._16_4_ = topT[3].elempack;
              auVar165._20_4_ = *(undefined4 *)&topT[3].field_0x1c;
              auVar165._24_8_ = topT[3].allocator;
              auVar166._0_4_ = topT[3].dims;
              auVar166._4_4_ = topT[3].w;
              auVar166._8_4_ = topT[3].h;
              auVar166._12_4_ = topT[3].d;
              auVar166._16_4_ = topT[3].c;
              auVar166._20_4_ = *(undefined4 *)&topT[3].field_0x3c;
              auVar166._24_8_ = topT[3].cstep;
              auVar168._0_8_ = topT[4].data;
              auVar168._8_8_ = topT[4].refcount;
              auVar168._16_8_ = topT[4].elemsize;
              auVar168._24_4_ = topT[4].elempack;
              auVar168._28_4_ = *(undefined4 *)&topT[4].field_0x1c;
              auVar169._0_8_ = topT[4].allocator;
              auVar169._8_4_ = topT[4].dims;
              auVar169._12_4_ = topT[4].w;
              auVar169._16_4_ = topT[4].h;
              auVar169._20_4_ = topT[4].d;
              auVar169._24_4_ = topT[4].c;
              auVar169._28_4_ = *(undefined4 *)&topT[4].field_0x3c;
              auVar204 = vunpcklps_avx(*(undefined1 (*) [32])&topT[1].c,auVar164);
              auVar107 = vunpckhps_avx(*(undefined1 (*) [32])&topT[1].c,auVar164);
              auVar207 = vunpcklps_avx(*(undefined1 (*) [32])&topT[2].h,auVar165);
              auVar108 = vunpckhps_avx(*(undefined1 (*) [32])&topT[2].h,auVar165);
              auVar211 = vunpcklps_avx(auVar166,auVar168);
              auVar109 = vunpckhps_avx(auVar166,auVar168);
              auVar167 = vunpcklps_avx(auVar169,*(undefined1 (*) [32])&topT[4].cstep);
              auVar110 = vunpckhps_avx(auVar169,*(undefined1 (*) [32])&topT[4].cstep);
              auVar111 = vunpcklpd_avx(auVar112,auVar113);
              auVar112 = vunpckhpd_avx(auVar112,auVar113);
              auVar174 = vunpcklpd_avx(auVar163,auVar106);
              auVar163 = vunpckhpd_avx(auVar163,auVar106);
              auVar201 = vunpcklpd_avx(auVar204,auVar207);
              auVar106 = vunpckhpd_avx(auVar204,auVar207);
              auVar204 = vunpcklpd_avx(auVar107,auVar108);
              auVar113 = vunpckhpd_avx(auVar107,auVar108);
              auVar207 = vunpcklpd_avx(auVar211,auVar167);
              auVar107 = vunpckhpd_avx(auVar211,auVar167);
              auVar211 = vunpcklpd_avx(auVar109,auVar110);
              auVar108 = vunpckhpd_avx(auVar109,auVar110);
              auVar170._16_16_ = auVar201._0_16_;
              auVar170._0_16_ = auVar111._0_16_;
              auVar171._16_16_ = auVar107._0_16_;
              auVar171._0_16_ = auVar106._0_16_;
              auVar172._16_16_ = auVar204._0_16_;
              auVar172._0_16_ = auVar174._0_16_;
              auVar173._16_16_ = auVar108._0_16_;
              auVar173._0_16_ = auVar113._0_16_;
              auVar109 = vperm2f128_avx(auVar111,auVar201,0x31);
              auVar106 = vperm2f128_avx(auVar106,auVar107,0x31);
              auVar107 = vperm2f128_avx(auVar174,auVar204,0x31);
              auVar113 = vperm2f128_avx(auVar113,auVar108,0x31);
              *(undefined1 (*) [32])(*pauVar133 + 0x10) = auVar170;
              *(undefined1 (*) [16])(pauVar133[1] + 0x10) = auVar207._0_16_;
              *(undefined1 (*) [16])(pauVar133[2] + 0x10) = auVar112._0_16_;
              pauVar133[3] = auVar171;
              *(undefined1 (*) [32])(pauVar133[4] + 0x10) = auVar172;
              *(undefined1 (*) [16])(pauVar133[5] + 0x10) = auVar211._0_16_;
              *(undefined1 (*) [16])(pauVar133[6] + 0x10) = auVar163._0_16_;
              pauVar133[7] = auVar173;
              *(undefined1 (*) [32])(pauVar133[8] + 0x10) = auVar109;
              *(undefined1 (*) [16])(pauVar133[9] + 0x10) = auVar207._16_16_;
              *(undefined1 (*) [16])(pauVar133[10] + 0x10) = auVar112._16_16_;
              pauVar133[0xb] = auVar106;
              *(undefined1 (*) [32])(pauVar133[0xc] + 0x10) = auVar107;
              *(undefined1 (*) [16])(pauVar133[0xd] + 0x10) = auVar211._16_16_;
              auVar149 = auVar163._16_16_;
              pauVar133[0xf] = auVar113;
              iVar138 = 0xc;
              lVar126 = 0x180;
            }
            *(undefined1 (*) [16])(pauVar133[0xe] + 0x10) = auVar149;
          }
          topT = (Mat *)((long)&topT->data + lVar126);
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar145 * 4);
        }
LAB_004b9dec:
        iVar131 = iVar138 + 0xf;
        while (iVar131 < max_jj) {
          auVar61._0_8_ = topT->data;
          auVar61._8_8_ = topT->refcount;
          auVar61._16_8_ = topT->elemsize;
          auVar61._24_4_ = topT->elempack;
          auVar61._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar62._0_8_ = topT->allocator;
          auVar62._8_4_ = topT->dims;
          auVar62._12_4_ = topT->w;
          auVar62._16_4_ = topT->h;
          auVar62._20_4_ = topT->d;
          auVar62._24_4_ = topT->c;
          auVar62._28_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar63._0_4_ = topT[1].elempack;
          auVar63._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar63._8_8_ = topT[1].allocator;
          auVar63._16_4_ = topT[1].dims;
          auVar63._20_4_ = topT[1].w;
          auVar63._24_4_ = topT[1].h;
          auVar63._28_4_ = topT[1].d;
          auVar64._0_8_ = topT[2].elemsize;
          auVar64._8_4_ = topT[2].elempack;
          auVar64._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
          auVar64._16_8_ = topT[2].allocator;
          auVar64._24_4_ = topT[2].dims;
          auVar64._28_4_ = topT[2].w;
          auVar65._0_8_ = topT[3].refcount;
          auVar65._8_8_ = topT[3].elemsize;
          auVar65._16_4_ = topT[3].elempack;
          auVar65._20_4_ = *(undefined4 *)&topT[3].field_0x1c;
          auVar65._24_8_ = topT[3].allocator;
          auVar66._0_4_ = topT[3].dims;
          auVar66._4_4_ = topT[3].w;
          auVar66._8_4_ = topT[3].h;
          auVar66._12_4_ = topT[3].d;
          auVar66._16_4_ = topT[3].c;
          auVar66._20_4_ = *(undefined4 *)&topT[3].field_0x3c;
          auVar66._24_8_ = topT[3].cstep;
          auVar67._0_8_ = topT[4].data;
          auVar67._8_8_ = topT[4].refcount;
          auVar67._16_8_ = topT[4].elemsize;
          auVar67._24_4_ = topT[4].elempack;
          auVar67._28_4_ = *(undefined4 *)&topT[4].field_0x1c;
          auVar68._0_8_ = topT[4].allocator;
          auVar68._8_4_ = topT[4].dims;
          auVar68._12_4_ = topT[4].w;
          auVar68._16_4_ = topT[4].h;
          auVar68._20_4_ = topT[4].d;
          auVar68._24_4_ = topT[4].c;
          auVar68._28_4_ = *(undefined4 *)&topT[4].field_0x3c;
          auVar69._0_4_ = topT[5].elempack;
          auVar69._4_4_ = *(undefined4 *)&topT[5].field_0x1c;
          auVar69._8_8_ = topT[5].allocator;
          auVar69._16_4_ = topT[5].dims;
          auVar69._20_4_ = topT[5].w;
          auVar69._24_4_ = topT[5].h;
          auVar69._28_4_ = topT[5].d;
          auVar70._0_8_ = topT[6].elemsize;
          auVar70._8_4_ = topT[6].elempack;
          auVar70._12_4_ = *(undefined4 *)&topT[6].field_0x1c;
          auVar70._16_8_ = topT[6].allocator;
          auVar70._24_4_ = topT[6].dims;
          auVar70._28_4_ = topT[6].w;
          auVar164 = vunpcklps_avx512vl(auVar61,auVar62);
          auVar163 = vunpckhps_avx(auVar61,auVar62);
          auVar111 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar63);
          auVar106 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar63);
          auVar174 = vunpcklps_avx(*(undefined1 (*) [32])&topT[1].c,auVar64);
          auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT[1].c,auVar64);
          auVar201 = vunpcklps_avx(*(undefined1 (*) [32])&topT[2].h,auVar65);
          auVar113 = vunpckhps_avx(*(undefined1 (*) [32])&topT[2].h,auVar65);
          auVar204 = vunpcklps_avx(auVar66,auVar67);
          auVar107 = vunpckhps_avx(auVar66,auVar67);
          auVar207 = vunpcklps_avx(auVar68,*(undefined1 (*) [32])&topT[4].cstep);
          auVar108 = vunpckhps_avx(auVar68,*(undefined1 (*) [32])&topT[4].cstep);
          auVar211 = vunpcklps_avx(auVar69,*(undefined1 (*) [32])&topT[5].c);
          auVar109 = vunpckhps_avx(auVar69,*(undefined1 (*) [32])&topT[5].c);
          auVar167 = vunpcklps_avx(auVar70,*(undefined1 (*) [32])&topT[6].h);
          auVar110 = vunpckhps_avx(auVar70,*(undefined1 (*) [32])&topT[6].h);
          auVar165 = vunpcklpd_avx512vl(auVar164,auVar111);
          auVar164 = vunpckhpd_avx512vl(auVar164,auVar111);
          auVar166 = vunpcklpd_avx512vl(auVar163,auVar106);
          auVar163 = vunpckhpd_avx(auVar163,auVar106);
          auVar111 = vunpcklpd_avx(auVar174,auVar201);
          auVar106 = vunpckhpd_avx(auVar174,auVar201);
          auVar174 = vunpcklpd_avx(auVar112,auVar113);
          auVar112 = vunpckhpd_avx(auVar112,auVar113);
          auVar201 = vunpcklpd_avx(auVar204,auVar207);
          auVar113 = vunpckhpd_avx(auVar204,auVar207);
          auVar204 = vunpcklpd_avx(auVar107,auVar108);
          auVar107 = vunpckhpd_avx(auVar107,auVar108);
          auVar207 = vunpcklpd_avx(auVar211,auVar167);
          auVar108 = vunpckhpd_avx(auVar211,auVar167);
          auVar211 = vunpcklpd_avx(auVar109,auVar110);
          auVar109 = vunpckhpd_avx(auVar109,auVar110);
          auVar215._16_16_ = auVar111._0_16_;
          auVar215._0_16_ = auVar165._0_16_;
          auVar167 = vinsertf32x4_avx512vl(auVar201,auVar207._0_16_,1);
          auVar168 = vinsertf32x4_avx512vl(auVar164,auVar106._0_16_,1);
          auVar169 = vinsertf32x4_avx512vl(auVar113,auVar108._0_16_,1);
          auVar170 = vinsertf32x4_avx512vl(auVar166,auVar174._0_16_,1);
          auVar171 = vinsertf32x4_avx512vl(auVar204,auVar211._0_16_,1);
          auVar172 = vinsertf32x4_avx512vl(auVar163,auVar112._0_16_,1);
          auVar173 = vinsertf32x4_avx512vl(auVar107,auVar109._0_16_,1);
          auVar110 = vperm2f128_avx(auVar165,auVar111,0x31);
          auVar111 = vperm2f128_avx(auVar201,auVar207,0x31);
          auVar106 = vperm2f128_avx(auVar164,auVar106,0x31);
          auVar113 = vperm2f128_avx(auVar113,auVar108,0x31);
          auVar174 = vshuff64x2_avx512vl(auVar166,auVar174,3);
          auVar108 = vperm2f128_avx(auVar204,auVar211,0x31);
          auVar163 = vperm2f128_avx(auVar163,auVar112,0x31);
          auVar112 = vperm2f128_avx(auVar107,auVar109,0x31);
          *pauVar133 = auVar215;
          pauVar133[1] = auVar167;
          pauVar133[2] = auVar168;
          pauVar133[3] = auVar169;
          pauVar133[4] = auVar170;
          pauVar133[5] = auVar171;
          pauVar133[6] = auVar172;
          pauVar133[7] = auVar173;
          pauVar133[8] = auVar110;
          pauVar133[9] = auVar111;
          pauVar133[10] = auVar106;
          pauVar133[0xb] = auVar113;
          pauVar133[0xc] = auVar174;
          pauVar133[0xd] = auVar108;
          pauVar133[0xe] = auVar163;
          pauVar133[0xf] = auVar112;
          topT = (Mat *)&topT[7].refcount;
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar142);
          iVar131 = iVar138 + 0x1f;
          iVar138 = iVar138 + 0x10;
        }
        iVar131 = iVar138 + 0xb;
        while (iVar131 < max_jj) {
          auVar71._0_8_ = topT->data;
          auVar71._8_8_ = topT->refcount;
          auVar71._16_8_ = topT->elemsize;
          auVar71._24_4_ = topT->elempack;
          auVar71._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar72._0_8_ = topT->allocator;
          auVar72._8_4_ = topT->dims;
          auVar72._12_4_ = topT->w;
          auVar72._16_4_ = topT->h;
          auVar72._20_4_ = topT->d;
          auVar72._24_4_ = topT->c;
          auVar72._28_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar73._0_4_ = topT[1].elempack;
          auVar73._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar73._8_8_ = topT[1].allocator;
          auVar73._16_4_ = topT[1].dims;
          auVar73._20_4_ = topT[1].w;
          auVar73._24_4_ = topT[1].h;
          auVar73._28_4_ = topT[1].d;
          auVar74._0_8_ = topT[2].elemsize;
          auVar74._8_4_ = topT[2].elempack;
          auVar74._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
          auVar74._16_8_ = topT[2].allocator;
          auVar74._24_4_ = topT[2].dims;
          auVar74._28_4_ = topT[2].w;
          auVar75._0_8_ = topT[3].refcount;
          auVar75._8_8_ = topT[3].elemsize;
          auVar75._16_4_ = topT[3].elempack;
          auVar75._20_4_ = *(undefined4 *)&topT[3].field_0x1c;
          auVar75._24_8_ = topT[3].allocator;
          auVar76._0_4_ = topT[3].dims;
          auVar76._4_4_ = topT[3].w;
          auVar76._8_4_ = topT[3].h;
          auVar76._12_4_ = topT[3].d;
          auVar76._16_4_ = topT[3].c;
          auVar76._20_4_ = *(undefined4 *)&topT[3].field_0x3c;
          auVar76._24_8_ = topT[3].cstep;
          auVar77._0_8_ = topT[4].data;
          auVar77._8_8_ = topT[4].refcount;
          auVar77._16_8_ = topT[4].elemsize;
          auVar77._24_4_ = topT[4].elempack;
          auVar77._28_4_ = *(undefined4 *)&topT[4].field_0x1c;
          auVar78._0_8_ = topT[4].allocator;
          auVar78._8_4_ = topT[4].dims;
          auVar78._12_4_ = topT[4].w;
          auVar78._16_4_ = topT[4].h;
          auVar78._20_4_ = topT[4].d;
          auVar78._24_4_ = topT[4].c;
          auVar78._28_4_ = *(undefined4 *)&topT[4].field_0x3c;
          auVar163 = vunpcklps_avx(auVar71,auVar72);
          auVar106 = vunpckhps_avx(auVar71,auVar72);
          auVar111 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar73);
          auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar73);
          auVar201 = vunpcklps_avx(*(undefined1 (*) [32])&topT[1].c,auVar74);
          auVar113 = vunpckhps_avx(*(undefined1 (*) [32])&topT[1].c,auVar74);
          auVar204 = vunpcklps_avx(*(undefined1 (*) [32])&topT[2].h,auVar75);
          auVar107 = vunpckhps_avx(*(undefined1 (*) [32])&topT[2].h,auVar75);
          auVar207 = vunpcklps_avx(auVar76,auVar77);
          auVar108 = vunpckhps_avx(auVar76,auVar77);
          auVar211 = vunpcklps_avx(auVar78,*(undefined1 (*) [32])&topT[4].cstep);
          auVar109 = vunpckhps_avx(auVar78,*(undefined1 (*) [32])&topT[4].cstep);
          auVar110 = vunpcklpd_avx(auVar163,auVar111);
          auVar163 = vunpckhpd_avx(auVar163,auVar111);
          auVar111 = vunpcklpd_avx(auVar106,auVar112);
          auVar106 = vunpckhpd_avx(auVar106,auVar112);
          auVar174 = vunpcklpd_avx(auVar201,auVar204);
          auVar112 = vunpckhpd_avx(auVar201,auVar204);
          auVar201 = vunpcklpd_avx(auVar113,auVar107);
          auVar113 = vunpckhpd_avx(auVar113,auVar107);
          auVar204 = vunpcklpd_avx(auVar207,auVar211);
          auVar107 = vunpckhpd_avx(auVar207,auVar211);
          auVar207 = vunpcklpd_avx(auVar108,auVar109);
          auVar108 = vunpckhpd_avx(auVar108,auVar109);
          auVar208._16_16_ = auVar174._0_16_;
          auVar208._0_16_ = auVar110._0_16_;
          auVar214._16_16_ = auVar107._0_16_;
          auVar214._0_16_ = auVar112._0_16_;
          auVar216._16_16_ = auVar201._0_16_;
          auVar216._0_16_ = auVar111._0_16_;
          auVar217._16_16_ = auVar108._0_16_;
          auVar217._0_16_ = auVar113._0_16_;
          auVar109 = vperm2f128_avx(auVar110,auVar174,0x31);
          auVar112 = vperm2f128_avx(auVar112,auVar107,0x31);
          auVar107 = vperm2f128_avx(auVar111,auVar201,0x31);
          auVar113 = vperm2f128_avx(auVar113,auVar108,0x31);
          *pauVar133 = auVar208;
          *(undefined1 (*) [16])pauVar133[1] = auVar204._0_16_;
          *(undefined1 (*) [16])pauVar133[2] = auVar163._0_16_;
          *(undefined1 (*) [32])(pauVar133[2] + 0x10) = auVar214;
          pauVar133[4] = auVar216;
          *(undefined1 (*) [16])pauVar133[5] = auVar207._0_16_;
          *(undefined1 (*) [16])pauVar133[6] = auVar106._0_16_;
          *(undefined1 (*) [32])(pauVar133[6] + 0x10) = auVar217;
          pauVar133[8] = auVar109;
          *(undefined1 (*) [16])pauVar133[9] = auVar204._16_16_;
          *(undefined1 (*) [16])pauVar133[10] = auVar163._16_16_;
          *(undefined1 (*) [32])(pauVar133[10] + 0x10) = auVar112;
          pauVar133[0xc] = auVar107;
          *(undefined1 (*) [16])pauVar133[0xd] = auVar207._16_16_;
          *(undefined1 (*) [16])pauVar133[0xe] = auVar106._16_16_;
          *(undefined1 (*) [32])(pauVar133[0xe] + 0x10) = auVar113;
          topT = (Mat *)&topT[5].elempack;
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar142);
          iVar131 = iVar138 + 0x17;
          iVar138 = iVar138 + 0xc;
        }
        iVar131 = iVar138 + 7;
        while (iVar131 < max_jj) {
          auVar79._0_8_ = topT->data;
          auVar79._8_8_ = topT->refcount;
          auVar79._16_8_ = topT->elemsize;
          auVar79._24_4_ = topT->elempack;
          auVar79._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar80._0_8_ = topT->allocator;
          auVar80._8_4_ = topT->dims;
          auVar80._12_4_ = topT->w;
          auVar80._16_4_ = topT->h;
          auVar80._20_4_ = topT->d;
          auVar80._24_4_ = topT->c;
          auVar80._28_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar81._0_4_ = topT[1].elempack;
          auVar81._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar81._8_8_ = topT[1].allocator;
          auVar81._16_4_ = topT[1].dims;
          auVar81._20_4_ = topT[1].w;
          auVar81._24_4_ = topT[1].h;
          auVar81._28_4_ = topT[1].d;
          auVar82._0_8_ = topT[2].elemsize;
          auVar82._8_4_ = topT[2].elempack;
          auVar82._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
          auVar82._16_8_ = topT[2].allocator;
          auVar82._24_4_ = topT[2].dims;
          auVar82._28_4_ = topT[2].w;
          auVar83._0_8_ = topT[3].refcount;
          auVar83._8_8_ = topT[3].elemsize;
          auVar83._16_4_ = topT[3].elempack;
          auVar83._20_4_ = *(undefined4 *)&topT[3].field_0x1c;
          auVar83._24_8_ = topT[3].allocator;
          auVar163 = vunpcklps_avx(auVar79,auVar80);
          auVar106 = vunpckhps_avx(auVar79,auVar80);
          auVar109 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar81);
          auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar81);
          auVar111 = vunpcklps_avx(*(undefined1 (*) [32])&topT[1].c,auVar82);
          auVar113 = vunpckhps_avx(*(undefined1 (*) [32])&topT[1].c,auVar82);
          auVar174 = vunpcklps_avx(*(undefined1 (*) [32])&topT[2].h,auVar83);
          auVar107 = vunpckhps_avx(*(undefined1 (*) [32])&topT[2].h,auVar83);
          auVar108 = vunpcklpd_avx(auVar163,auVar109);
          auVar163 = vunpckhpd_avx(auVar163,auVar109);
          auVar109 = vunpcklpd_avx(auVar106,auVar112);
          auVar106 = vunpckhpd_avx(auVar106,auVar112);
          auVar110 = vunpcklpd_avx(auVar111,auVar174);
          auVar112 = vunpckhpd_avx(auVar111,auVar174);
          auVar111 = vunpcklpd_avx(auVar113,auVar107);
          auVar113 = vunpckhpd_avx(auVar113,auVar107);
          auVar202._16_16_ = auVar110._0_16_;
          auVar202._0_16_ = auVar108._0_16_;
          auVar205._16_16_ = auVar112._0_16_;
          auVar205._0_16_ = auVar163._0_16_;
          auVar209._16_16_ = auVar111._0_16_;
          auVar209._0_16_ = auVar109._0_16_;
          auVar212._16_16_ = auVar113._0_16_;
          auVar212._0_16_ = auVar106._0_16_;
          auVar107 = vperm2f128_avx(auVar108,auVar110,0x31);
          auVar163 = vperm2f128_avx(auVar163,auVar112,0x31);
          auVar112 = vperm2f128_avx(auVar109,auVar111,0x31);
          auVar106 = vperm2f128_avx(auVar106,auVar113,0x31);
          *pauVar133 = auVar202;
          pauVar133[2] = auVar205;
          pauVar133[4] = auVar209;
          pauVar133[6] = auVar212;
          pauVar133[8] = auVar107;
          pauVar133[10] = auVar163;
          pauVar133[0xc] = auVar112;
          pauVar133[0xe] = auVar106;
          topT = (Mat *)&topT[3].dims;
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar142);
          iVar131 = iVar138 + 0xf;
          iVar138 = iVar138 + 8;
        }
        iVar138 = iVar138 + 3;
        if (iVar138 < max_jj) {
          pauVar133 = pauVar133 + 0xe;
          do {
            auVar84._0_8_ = topT->data;
            auVar84._8_8_ = topT->refcount;
            auVar84._16_8_ = topT->elemsize;
            auVar84._24_4_ = topT->elempack;
            auVar84._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar85._0_8_ = topT->allocator;
            auVar85._8_4_ = topT->dims;
            auVar85._12_4_ = topT->w;
            auVar85._16_4_ = topT->h;
            auVar85._20_4_ = topT->d;
            auVar85._24_4_ = topT->c;
            auVar85._28_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar86._0_4_ = topT[1].elempack;
            auVar86._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
            auVar86._8_8_ = topT[1].allocator;
            auVar86._16_4_ = topT[1].dims;
            auVar86._20_4_ = topT[1].w;
            auVar86._24_4_ = topT[1].h;
            auVar86._28_4_ = topT[1].d;
            auVar163 = vunpcklps_avx(auVar84,auVar85);
            auVar106 = vunpckhps_avx(auVar84,auVar85);
            auVar107 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar86);
            auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar86);
            auVar113 = vunpcklpd_avx(auVar163,auVar107);
            auVar163 = vunpckhpd_avx(auVar163,auVar107);
            auVar107 = vunpcklpd_avx(auVar106,auVar112);
            auVar106 = vunpckhpd_avx(auVar106,auVar112);
            *(undefined1 (*) [16])pauVar133[-0xe] = auVar113._0_16_;
            *(undefined1 (*) [16])pauVar133[-0xc] = auVar163._0_16_;
            *(undefined1 (*) [16])pauVar133[-10] = auVar107._0_16_;
            *(undefined1 (*) [16])pauVar133[-8] = auVar106._0_16_;
            *(undefined1 (*) [16])pauVar133[-6] = auVar113._16_16_;
            *(undefined1 (*) [16])pauVar133[-4] = auVar163._16_16_;
            *(undefined1 (*) [16])pauVar133[-2] = auVar107._16_16_;
            *(undefined1 (*) [16])*pauVar133 = auVar106._16_16_;
            topT = (Mat *)&topT[1].c;
            pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar142);
            iVar138 = iVar138 + 4;
          } while (iVar138 < max_jj);
        }
      }
      if (iVar101 == 8) {
        pauVar133 = (undefined1 (*) [32])
                    ((long)top_blob->data +
                    (lVar147 + uVar135) * 0x20 + (long)(int)((uVar122 >> 3) * iVar123) * 4);
        uVar139 = 0;
        if ((j & 0x80000007U) == 4) {
          auVar87._0_8_ = topT->data;
          auVar87._8_8_ = topT->refcount;
          auVar87._16_8_ = topT->elemsize;
          auVar87._24_4_ = topT->elempack;
          auVar87._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar88._0_8_ = topT->allocator;
          auVar88._8_4_ = topT->dims;
          auVar88._12_4_ = topT->w;
          auVar88._16_4_ = topT->h;
          auVar88._20_4_ = topT->d;
          auVar88._24_4_ = topT->c;
          auVar88._28_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar89._0_4_ = topT[1].elempack;
          auVar89._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar89._8_8_ = topT[1].allocator;
          auVar89._16_4_ = topT[1].dims;
          auVar89._20_4_ = topT[1].w;
          auVar89._24_4_ = topT[1].h;
          auVar89._28_4_ = topT[1].d;
          auVar163 = vunpcklps_avx(auVar87,auVar88);
          auVar106 = vunpckhps_avx(auVar87,auVar88);
          auVar107 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar89);
          auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar89);
          auVar113 = vunpcklpd_avx(auVar163,auVar107);
          auVar163 = vunpckhpd_avx(auVar163,auVar107);
          auVar107 = vunpcklpd_avx(auVar106,auVar112);
          auVar106 = vunpckhpd_avx(auVar106,auVar112);
          *(undefined1 (*) [16])(*pauVar133 + 0x10) = auVar113._0_16_;
          *(undefined1 (*) [16])(pauVar133[1] + 0x10) = auVar163._0_16_;
          *(undefined1 (*) [16])(pauVar133[2] + 0x10) = auVar107._0_16_;
          *(undefined1 (*) [16])(pauVar133[3] + 0x10) = auVar106._0_16_;
          *(undefined1 (*) [16])(pauVar133[4] + 0x10) = auVar113._16_16_;
          *(undefined1 (*) [16])(pauVar133[5] + 0x10) = auVar163._16_16_;
          *(undefined1 (*) [16])(pauVar133[6] + 0x10) = auVar107._16_16_;
          *(undefined1 (*) [16])(pauVar133[7] + 0x10) = auVar106._16_16_;
          topT = (Mat *)&topT[1].c;
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + (long)iVar123 * 4);
          uVar139 = 4;
        }
        iVar138 = uVar139 + 7;
        while (iVar138 < max_jj) {
          auVar90._0_8_ = topT->data;
          auVar90._8_8_ = topT->refcount;
          auVar90._16_8_ = topT->elemsize;
          auVar90._24_4_ = topT->elempack;
          auVar90._28_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar91._0_8_ = topT->allocator;
          auVar91._8_4_ = topT->dims;
          auVar91._12_4_ = topT->w;
          auVar91._16_4_ = topT->h;
          auVar91._20_4_ = topT->d;
          auVar91._24_4_ = topT->c;
          auVar91._28_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar92._0_4_ = topT[1].elempack;
          auVar92._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar92._8_8_ = topT[1].allocator;
          auVar92._16_4_ = topT[1].dims;
          auVar92._20_4_ = topT[1].w;
          auVar92._24_4_ = topT[1].h;
          auVar92._28_4_ = topT[1].d;
          auVar93._0_8_ = topT[2].elemsize;
          auVar93._8_4_ = topT[2].elempack;
          auVar93._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
          auVar93._16_8_ = topT[2].allocator;
          auVar93._24_4_ = topT[2].dims;
          auVar93._28_4_ = topT[2].w;
          auVar94._0_8_ = topT[3].refcount;
          auVar94._8_8_ = topT[3].elemsize;
          auVar94._16_4_ = topT[3].elempack;
          auVar94._20_4_ = *(undefined4 *)&topT[3].field_0x1c;
          auVar94._24_8_ = topT[3].allocator;
          auVar163 = vunpcklps_avx(auVar90,auVar91);
          auVar106 = vunpckhps_avx(auVar90,auVar91);
          auVar109 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar92);
          auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar92);
          auVar111 = vunpcklps_avx(*(undefined1 (*) [32])&topT[1].c,auVar93);
          auVar113 = vunpckhps_avx(*(undefined1 (*) [32])&topT[1].c,auVar93);
          auVar174 = vunpcklps_avx(*(undefined1 (*) [32])&topT[2].h,auVar94);
          auVar107 = vunpckhps_avx(*(undefined1 (*) [32])&topT[2].h,auVar94);
          auVar108 = vunpcklpd_avx(auVar163,auVar109);
          auVar163 = vunpckhpd_avx(auVar163,auVar109);
          auVar109 = vunpcklpd_avx(auVar106,auVar112);
          auVar106 = vunpckhpd_avx(auVar106,auVar112);
          auVar110 = vunpcklpd_avx(auVar111,auVar174);
          auVar112 = vunpckhpd_avx(auVar111,auVar174);
          auVar111 = vunpcklpd_avx(auVar113,auVar107);
          auVar113 = vunpckhpd_avx(auVar113,auVar107);
          auVar203._16_16_ = auVar110._0_16_;
          auVar203._0_16_ = auVar108._0_16_;
          auVar206._16_16_ = auVar112._0_16_;
          auVar206._0_16_ = auVar163._0_16_;
          auVar210._16_16_ = auVar111._0_16_;
          auVar210._0_16_ = auVar109._0_16_;
          auVar213._16_16_ = auVar113._0_16_;
          auVar213._0_16_ = auVar106._0_16_;
          auVar107 = vperm2f128_avx(auVar108,auVar110,0x31);
          auVar163 = vperm2f128_avx(auVar163,auVar112,0x31);
          auVar112 = vperm2f128_avx(auVar109,auVar111,0x31);
          auVar106 = vperm2f128_avx(auVar106,auVar113,0x31);
          *pauVar133 = auVar203;
          pauVar133[1] = auVar206;
          pauVar133[2] = auVar210;
          pauVar133[3] = auVar213;
          pauVar133[4] = auVar107;
          pauVar133[5] = auVar163;
          pauVar133[6] = auVar112;
          pauVar133[7] = auVar106;
          topT = (Mat *)&topT[3].dims;
          pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar144);
          iVar138 = uVar139 + 0xf;
          uVar139 = uVar139 + 8;
        }
        uVar139 = uVar139 | 3;
        if ((int)uVar139 < max_jj) {
          pauVar133 = pauVar133 + 7;
          do {
            auVar95._0_8_ = topT->data;
            auVar95._8_8_ = topT->refcount;
            auVar95._16_8_ = topT->elemsize;
            auVar95._24_4_ = topT->elempack;
            auVar95._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar96._0_8_ = topT->allocator;
            auVar96._8_4_ = topT->dims;
            auVar96._12_4_ = topT->w;
            auVar96._16_4_ = topT->h;
            auVar96._20_4_ = topT->d;
            auVar96._24_4_ = topT->c;
            auVar96._28_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar97._0_4_ = topT[1].elempack;
            auVar97._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
            auVar97._8_8_ = topT[1].allocator;
            auVar97._16_4_ = topT[1].dims;
            auVar97._20_4_ = topT[1].w;
            auVar97._24_4_ = topT[1].h;
            auVar97._28_4_ = topT[1].d;
            auVar163 = vunpcklps_avx(auVar95,auVar96);
            auVar106 = vunpckhps_avx(auVar95,auVar96);
            auVar107 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar97);
            auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar97);
            auVar113 = vunpcklpd_avx(auVar163,auVar107);
            auVar163 = vunpckhpd_avx(auVar163,auVar107);
            auVar107 = vunpcklpd_avx(auVar106,auVar112);
            auVar106 = vunpckhpd_avx(auVar106,auVar112);
            *(undefined1 (*) [16])pauVar133[-7] = auVar113._0_16_;
            *(undefined1 (*) [16])pauVar133[-6] = auVar163._0_16_;
            *(undefined1 (*) [16])pauVar133[-5] = auVar107._0_16_;
            *(undefined1 (*) [16])pauVar133[-4] = auVar106._0_16_;
            *(undefined1 (*) [16])pauVar133[-3] = auVar113._16_16_;
            *(undefined1 (*) [16])pauVar133[-2] = auVar163._16_16_;
            *(undefined1 (*) [16])pauVar133[-1] = auVar107._16_16_;
            *(undefined1 (*) [16])*pauVar133 = auVar106._16_16_;
            topT = (Mat *)&topT[1].c;
            pauVar133 = (undefined1 (*) [32])(*pauVar133 + lVar144);
            uVar139 = uVar139 + 4;
          } while ((int)uVar139 < max_jj);
        }
      }
      if (iVar101 == 4) {
        if (3 < max_jj) {
          pauVar133 = (undefined1 (*) [32])((long)top_blob->data + lVar141);
          iVar138 = 3;
          do {
            auVar98._0_8_ = topT->data;
            auVar98._8_8_ = topT->refcount;
            auVar98._16_8_ = topT->elemsize;
            auVar98._24_4_ = topT->elempack;
            auVar98._28_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar99._0_8_ = topT->allocator;
            auVar99._8_4_ = topT->dims;
            auVar99._12_4_ = topT->w;
            auVar99._16_4_ = topT->h;
            auVar99._20_4_ = topT->d;
            auVar99._24_4_ = topT->c;
            auVar99._28_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar100._0_4_ = topT[1].elempack;
            auVar100._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
            auVar100._8_8_ = topT[1].allocator;
            auVar100._16_4_ = topT[1].dims;
            auVar100._20_4_ = topT[1].w;
            auVar100._24_4_ = topT[1].h;
            auVar100._28_4_ = topT[1].d;
            auVar163 = vunpcklps_avx(auVar98,auVar99);
            auVar106 = vunpckhps_avx(auVar98,auVar99);
            auVar107 = vunpcklps_avx(*(undefined1 (*) [32])&topT->cstep,auVar100);
            auVar112 = vunpckhps_avx(*(undefined1 (*) [32])&topT->cstep,auVar100);
            auVar113 = vunpcklpd_avx(auVar163,auVar107);
            auVar163 = vunpckhpd_avx(auVar163,auVar107);
            auVar107 = vunpcklpd_avx(auVar106,auVar112);
            auVar106 = vunpckhpd_avx(auVar106,auVar112);
            auVar199._16_16_ = auVar163._0_16_;
            auVar199._0_16_ = auVar113._0_16_;
            auVar200._16_16_ = auVar106._0_16_;
            auVar200._0_16_ = auVar107._0_16_;
            auVar163 = vperm2f128_avx(auVar113,auVar163,0x31);
            auVar106 = vperm2f128_avx(auVar107,auVar106,0x31);
            pauVar133[-3] = auVar199;
            pauVar133[-2] = auVar200;
            pauVar133[-1] = auVar163;
            *pauVar133 = auVar106;
            topT = (Mat *)&topT[1].c;
            pauVar133 = (undefined1 (*) [32])(*pauVar133 + (long)(iVar102 * 4) * 4);
            iVar138 = iVar138 + 4;
          } while (iVar138 < max_jj);
          goto LAB_004ba606;
        }
      }
      else {
LAB_004ba606:
        if (0 < max_jj && iVar101 == 1) {
          pauVar133 = (undefined1 (*) [32])((long)top_blob->data + lVar148);
          iVar138 = max_jj;
          do {
            *pauVar133 = *(undefined1 (*) [32])topT;
            topT = (Mat *)&topT->allocator;
            pauVar133 = (undefined1 (*) [32])(*pauVar133 + (long)iVar102 * 4);
            iVar138 = iVar138 + -1;
          } while (iVar138 != 0);
        }
      }
      uVar132 = uVar135 + 8;
      lVar126 = uVar135 + 0xf;
      lVar141 = lVar141 + 0x80;
      lVar148 = lVar148 + 0x20;
      uVar135 = uVar132;
    } while (lVar126 < max_ii);
  }
  if ((int)((uint)uVar132 | 3) < max_ii) {
    iVar129 = iVar102 * 8;
    uVar130 = j + 7;
    iVar123 = j + 0xf;
    if (-1 < j) {
      uVar130 = j;
      iVar123 = j;
    }
    iVar138 = j % 0x10;
    lVar145 = (long)(iVar102 * 0x10);
    uVar135 = uVar132 & 0xffffffff;
    lVar147 = (long)i;
    lVar142 = lVar145 * 4;
    lVar144 = (long)iVar129 * 4;
    lVar141 = (lVar147 + uVar135) * 0x10 + (long)(iVar102 * j) * 4 + 0x30;
    lVar148 = (long)(iVar102 * j) * 4 + lVar147 * 4 + uVar135 * 4;
    do {
      if (iVar101 == 0x10) {
        pauVar134 = (undefined1 (*) [16])
                    ((long)top_blob->data +
                    (uVar135 + lVar147) * 0x40 + (long)((iVar123 >> 4) * iVar102 * 0x10) * 4);
        if (iVar138 == 0xc) {
          auVar149._0_8_ = topT->data;
          auVar149._8_8_ = topT->refcount;
          auVar104._0_8_ = topT->elemsize;
          auVar104._8_4_ = topT->elempack;
          auVar104._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar150._0_8_ = topT->allocator;
          auVar150._8_4_ = topT->dims;
          auVar150._12_4_ = topT->w;
          auVar151._0_4_ = topT->h;
          auVar151._4_4_ = topT->d;
          auVar151._8_4_ = topT->c;
          auVar151._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar155 = vunpcklps_avx(auVar149,auVar104);
          auVar103 = vunpcklps_avx(auVar150,auVar151);
          auVar104 = vunpckhps_avx(auVar149,auVar104);
          auVar150 = vunpckhps_avx(auVar150,auVar151);
          auVar151 = vunpcklpd_avx(auVar155,auVar103);
          auVar149 = vunpckhpd_avx(auVar155,auVar103);
          auVar155 = vunpcklpd_avx(auVar104,auVar150);
          auVar104 = vunpckhpd_avx(auVar104,auVar150);
          pauVar134[3] = auVar151;
          pauVar134[7] = auVar149;
          pauVar134[0xb] = auVar155;
          pauVar134[0xf] = auVar104;
          topT = (Mat *)&topT->cstep;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar145 * 4);
          iVar131 = 4;
        }
        else if (iVar138 == 8) {
          auVar155._0_8_ = topT->data;
          auVar155._8_8_ = topT->refcount;
          auVar103._0_8_ = topT->elemsize;
          auVar103._8_4_ = topT->elempack;
          auVar103._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar158._0_8_ = topT->allocator;
          auVar158._8_4_ = topT->dims;
          auVar158._12_4_ = topT->w;
          auVar105._0_4_ = topT->h;
          auVar105._4_4_ = topT->d;
          auVar105._8_4_ = topT->c;
          auVar105._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar150 = vunpcklps_avx(auVar155,auVar103);
          auVar151 = vunpcklps_avx(auVar158,auVar105);
          auVar149 = vunpckhps_avx(auVar155,auVar103);
          auVar104 = vunpckhps_avx(auVar158,auVar105);
          if (max_jj < 5) {
            auVar155 = vunpcklpd_avx(auVar150,auVar151);
            auVar150 = vunpckhpd_avx(auVar150,auVar151);
            auVar151 = vunpcklpd_avx(auVar149,auVar104);
            auVar149 = vunpckhpd_avx(auVar149,auVar104);
            iVar131 = 4;
            lVar126 = 0x40;
            lVar140 = 0x20;
          }
          else {
            auVar152._0_8_ = topT[1].refcount;
            auVar152._8_8_ = topT[1].elemsize;
            auVar153._0_4_ = topT[1].elempack;
            auVar153._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
            auVar153._8_8_ = topT[1].allocator;
            auVar154._0_4_ = topT[1].dims;
            auVar154._4_4_ = topT[1].w;
            auVar154._8_4_ = topT[1].h;
            auVar154._12_4_ = topT[1].d;
            auVar158 = vunpcklpd_avx(auVar150,auVar151);
            auVar150 = vunpckhpd_avx(auVar150,auVar151);
            auVar151 = vunpcklpd_avx(auVar149,auVar104);
            auVar149 = vunpckhpd_avx(auVar149,auVar104);
            auVar104 = vunpcklps_avx(*(undefined1 (*) [16])&topT->cstep,auVar152);
            auVar156 = vunpcklps_avx(auVar153,auVar154);
            auVar155 = vunpckhps_avx(*(undefined1 (*) [16])&topT->cstep,auVar152);
            auVar103 = vunpckhps_avx(auVar153,auVar154);
            auVar105 = vunpcklpd_avx(auVar104,auVar156);
            auVar104 = vunpckhpd_avx(auVar104,auVar156);
            auVar152 = vunpcklpd_avx(auVar155,auVar103);
            auVar155 = vunpckhpd_avx(auVar155,auVar103);
            pauVar134[2] = auVar158;
            pauVar134[3] = auVar105;
            pauVar134[7] = auVar104;
            pauVar134[0xb] = auVar152;
            iVar131 = 8;
            lVar126 = 0x80;
            lVar140 = 0xf0;
          }
          *(undefined1 (*) [16])(*pauVar134 + lVar140) = auVar155;
          topT = (Mat *)((long)&topT->data + lVar126);
          pauVar134[6] = auVar150;
          pauVar134[10] = auVar151;
          pauVar134[0xe] = auVar149;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar145 * 4);
        }
        else {
          iVar131 = 0;
          if (iVar138 == 4) {
            auVar156._0_8_ = topT->data;
            auVar156._8_8_ = topT->refcount;
            auVar157._0_8_ = topT->elemsize;
            auVar157._8_4_ = topT->elempack;
            auVar157._12_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar159._0_8_ = topT->allocator;
            auVar159._8_4_ = topT->dims;
            auVar159._12_4_ = topT->w;
            auVar160._0_4_ = topT->h;
            auVar160._4_4_ = topT->d;
            auVar160._8_4_ = topT->c;
            auVar160._12_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar150 = vunpcklps_avx(auVar156,auVar157);
            auVar151 = vunpcklps_avx(auVar159,auVar160);
            auVar149 = vunpckhps_avx(auVar156,auVar157);
            auVar104 = vunpckhps_avx(auVar159,auVar160);
            if (max_jj < 5) {
              auVar155 = vunpcklpd_avx(auVar150,auVar151);
              auVar150 = vunpckhpd_avx(auVar150,auVar151);
              auVar151 = vunpcklpd_avx(auVar149,auVar104);
              auVar149 = vunpckhpd_avx(auVar149,auVar104);
              iVar131 = 4;
              lVar126 = 0x40;
              lVar140 = 0x50;
              lVar146 = 0x10;
            }
            else {
              auVar161._0_8_ = topT[1].refcount;
              auVar161._8_8_ = topT[1].elemsize;
              auVar162._0_4_ = topT[1].elempack;
              auVar162._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
              auVar162._8_8_ = topT[1].allocator;
              auVar1._0_4_ = topT[1].dims;
              auVar1._4_4_ = topT[1].w;
              auVar1._8_4_ = topT[1].h;
              auVar1._12_4_ = topT[1].d;
              auVar2._0_4_ = topT[1].c;
              auVar2._4_4_ = *(undefined4 *)&topT[1].field_0x3c;
              auVar2._8_8_ = topT[1].cstep;
              auVar3._0_8_ = topT[2].data;
              auVar3._8_8_ = topT[2].refcount;
              auVar4._0_8_ = topT[2].elemsize;
              auVar4._8_4_ = topT[2].elempack;
              auVar4._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
              auVar5._0_8_ = topT[2].allocator;
              auVar5._8_4_ = topT[2].dims;
              auVar5._12_4_ = topT[2].w;
              auVar152 = vunpcklpd_avx(auVar150,auVar151);
              auVar103 = vunpckhpd_avx(auVar150,auVar151);
              auVar151 = vunpcklpd_avx(auVar149,auVar104);
              auVar149 = vunpckhpd_avx(auVar149,auVar104);
              auVar104 = vunpcklps_avx(*(undefined1 (*) [16])&topT->cstep,auVar161);
              auVar158 = vunpcklps_avx(auVar162,auVar1);
              auVar150 = vunpckhps_avx(*(undefined1 (*) [16])&topT->cstep,auVar161);
              auVar155 = vunpckhps_avx(auVar162,auVar1);
              auVar153 = vunpcklpd_avx(auVar104,auVar158);
              auVar104 = vunpckhpd_avx(auVar104,auVar158);
              auVar154 = vunpcklpd_avx(auVar150,auVar155);
              auVar155 = vunpckhpd_avx(auVar150,auVar155);
              auVar158 = vunpcklps_avx(auVar2,auVar3);
              auVar157 = vunpcklps_avx(auVar4,auVar5);
              auVar150 = vunpckhps_avx(auVar2,auVar3);
              auVar105 = vunpckhps_avx(auVar4,auVar5);
              auVar156 = vunpcklpd_avx(auVar158,auVar157);
              auVar158 = vunpckhpd_avx(auVar158,auVar157);
              auVar157 = vunpcklpd_avx(auVar150,auVar105);
              auVar150 = vunpckhpd_avx(auVar150,auVar105);
              pauVar134[1] = auVar152;
              pauVar134[2] = auVar153;
              pauVar134[3] = auVar156;
              pauVar134[5] = auVar103;
              pauVar134[6] = auVar104;
              pauVar134[7] = auVar158;
              pauVar134[10] = auVar154;
              pauVar134[0xb] = auVar157;
              iVar131 = 0xc;
              lVar126 = 0xc0;
              lVar140 = 0xf0;
              lVar146 = 0xe0;
            }
            *(undefined1 (*) [16])(*pauVar134 + lVar146) = auVar155;
            *(undefined1 (*) [16])(*pauVar134 + lVar140) = auVar150;
            topT = (Mat *)((long)&topT->data + lVar126);
            pauVar134[9] = auVar151;
            pauVar134[0xd] = auVar149;
            pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar145 * 4);
          }
        }
        iVar121 = iVar131 + 0xf;
        while (iVar121 < max_jj) {
          auVar6._0_8_ = topT->data;
          auVar6._8_8_ = topT->refcount;
          auVar7._0_8_ = topT->elemsize;
          auVar7._8_4_ = topT->elempack;
          auVar7._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar8._0_8_ = topT->allocator;
          auVar8._8_4_ = topT->dims;
          auVar8._12_4_ = topT->w;
          auVar9._0_4_ = topT->h;
          auVar9._4_4_ = topT->d;
          auVar9._8_4_ = topT->c;
          auVar9._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar10._0_8_ = topT[1].refcount;
          auVar10._8_8_ = topT[1].elemsize;
          auVar11._0_4_ = topT[1].elempack;
          auVar11._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar11._8_8_ = topT[1].allocator;
          auVar12._0_4_ = topT[1].dims;
          auVar12._4_4_ = topT[1].w;
          auVar12._8_4_ = topT[1].h;
          auVar12._12_4_ = topT[1].d;
          auVar13._0_4_ = topT[1].c;
          auVar13._4_4_ = *(undefined4 *)&topT[1].field_0x3c;
          auVar13._8_8_ = topT[1].cstep;
          auVar14._0_8_ = topT[2].data;
          auVar14._8_8_ = topT[2].refcount;
          auVar15._0_8_ = topT[2].elemsize;
          auVar15._8_4_ = topT[2].elempack;
          auVar15._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
          auVar16._0_8_ = topT[2].allocator;
          auVar16._8_4_ = topT[2].dims;
          auVar16._12_4_ = topT[2].w;
          auVar17._0_4_ = topT[2].h;
          auVar17._4_4_ = topT[2].d;
          auVar17._8_4_ = topT[2].c;
          auVar17._12_4_ = *(undefined4 *)&topT[2].field_0x3c;
          auVar18._0_8_ = topT[3].refcount;
          auVar18._8_8_ = topT[3].elemsize;
          auVar19._0_4_ = topT[3].elempack;
          auVar19._4_4_ = *(undefined4 *)&topT[3].field_0x1c;
          auVar19._8_8_ = topT[3].allocator;
          auVar150 = vunpcklps_avx512vl(auVar6,auVar7);
          auVar151 = vunpcklps_avx512vl(auVar8,auVar9);
          auVar149 = vunpckhps_avx(auVar6,auVar7);
          auVar104 = vunpckhps_avx(auVar8,auVar9);
          auVar152 = vunpcklpd_avx512vl(auVar150,auVar151);
          auVar153 = vunpckhpd_avx512vl(auVar150,auVar151);
          auVar154 = vunpcklpd_avx512vl(auVar149,auVar104);
          auVar149 = vunpckhpd_avx(auVar149,auVar104);
          auVar151 = vunpcklps_avx(*(undefined1 (*) [16])&topT->cstep,auVar10);
          auVar155 = vunpcklps_avx512vl(auVar11,auVar12);
          auVar104 = vunpckhps_avx(*(undefined1 (*) [16])&topT->cstep,auVar10);
          auVar150 = vunpckhps_avx(auVar11,auVar12);
          auVar156 = vunpcklpd_avx512vl(auVar151,auVar155);
          auVar157 = vunpckhpd_avx512vl(auVar151,auVar155);
          auVar103 = vunpcklpd_avx(auVar104,auVar150);
          auVar104 = vunpckhpd_avx(auVar104,auVar150);
          auVar155 = vunpcklps_avx(auVar13,auVar14);
          auVar158 = vunpcklps_avx512vl(auVar15,auVar16);
          auVar150 = vunpckhps_avx(auVar13,auVar14);
          auVar151 = vunpckhps_avx(auVar15,auVar16);
          auVar159 = vunpcklpd_avx512vl(auVar155,auVar158);
          auVar160 = vunpckhpd_avx512vl(auVar155,auVar158);
          auVar158 = vunpcklpd_avx(auVar150,auVar151);
          auVar150 = vunpckhpd_avx(auVar150,auVar151);
          auVar105 = vunpcklps_avx(auVar17,*(undefined1 (*) [16])&topT[2].cstep);
          auVar161 = vunpcklps_avx512vl(auVar18,auVar19);
          auVar151 = vunpckhps_avx(auVar17,*(undefined1 (*) [16])&topT[2].cstep);
          auVar155 = vunpckhps_avx(auVar18,auVar19);
          auVar162 = vunpcklpd_avx512vl(auVar105,auVar161);
          auVar161 = vunpckhpd_avx512vl(auVar105,auVar161);
          auVar105 = vunpcklpd_avx(auVar151,auVar155);
          auVar151 = vunpckhpd_avx(auVar151,auVar155);
          *pauVar134 = auVar152;
          pauVar134[1] = auVar156;
          pauVar134[2] = auVar159;
          pauVar134[3] = auVar162;
          pauVar134[4] = auVar153;
          pauVar134[5] = auVar157;
          pauVar134[6] = auVar160;
          pauVar134[7] = auVar161;
          pauVar134[8] = auVar154;
          pauVar134[9] = auVar103;
          pauVar134[10] = auVar158;
          pauVar134[0xb] = auVar105;
          pauVar134[0xc] = auVar149;
          pauVar134[0xd] = auVar104;
          pauVar134[0xe] = auVar150;
          pauVar134[0xf] = auVar151;
          topT = (Mat *)&topT[3].dims;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar142);
          iVar121 = iVar131 + 0x1f;
          iVar131 = iVar131 + 0x10;
        }
        iVar121 = iVar131 + 0xb;
        while (iVar121 < max_jj) {
          auVar20._0_8_ = topT->data;
          auVar20._8_8_ = topT->refcount;
          auVar21._0_8_ = topT->elemsize;
          auVar21._8_4_ = topT->elempack;
          auVar21._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar22._0_8_ = topT->allocator;
          auVar22._8_4_ = topT->dims;
          auVar22._12_4_ = topT->w;
          auVar23._0_4_ = topT->h;
          auVar23._4_4_ = topT->d;
          auVar23._8_4_ = topT->c;
          auVar23._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar24._0_8_ = topT[1].refcount;
          auVar24._8_8_ = topT[1].elemsize;
          auVar25._0_4_ = topT[1].elempack;
          auVar25._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar25._8_8_ = topT[1].allocator;
          auVar26._0_4_ = topT[1].dims;
          auVar26._4_4_ = topT[1].w;
          auVar26._8_4_ = topT[1].h;
          auVar26._12_4_ = topT[1].d;
          auVar27._0_4_ = topT[1].c;
          auVar27._4_4_ = *(undefined4 *)&topT[1].field_0x3c;
          auVar27._8_8_ = topT[1].cstep;
          auVar28._0_8_ = topT[2].data;
          auVar28._8_8_ = topT[2].refcount;
          auVar29._0_8_ = topT[2].elemsize;
          auVar29._8_4_ = topT[2].elempack;
          auVar29._12_4_ = *(undefined4 *)&topT[2].field_0x1c;
          auVar30._0_8_ = topT[2].allocator;
          auVar30._8_4_ = topT[2].dims;
          auVar30._12_4_ = topT[2].w;
          auVar149 = vunpcklps_avx(auVar20,auVar21);
          auVar151 = vunpcklps_avx(auVar22,auVar23);
          auVar104 = vunpckhps_avx(auVar20,auVar21);
          auVar150 = vunpckhps_avx(auVar22,auVar23);
          auVar105 = vunpcklpd_avx(auVar149,auVar151);
          auVar149 = vunpckhpd_avx(auVar149,auVar151);
          auVar152 = vunpcklpd_avx(auVar104,auVar150);
          auVar104 = vunpckhpd_avx(auVar104,auVar150);
          auVar150 = vunpcklps_avx(*(undefined1 (*) [16])&topT->cstep,auVar24);
          auVar103 = vunpcklps_avx(auVar25,auVar26);
          auVar151 = vunpckhps_avx(*(undefined1 (*) [16])&topT->cstep,auVar24);
          auVar155 = vunpckhps_avx(auVar25,auVar26);
          auVar153 = vunpcklpd_avx(auVar150,auVar103);
          auVar150 = vunpckhpd_avx(auVar150,auVar103);
          auVar154 = vunpcklpd_avx(auVar151,auVar155);
          auVar151 = vunpckhpd_avx(auVar151,auVar155);
          auVar155 = vunpcklps_avx(auVar27,auVar28);
          auVar157 = vunpcklps_avx(auVar29,auVar30);
          auVar103 = vunpckhps_avx(auVar27,auVar28);
          auVar158 = vunpckhps_avx(auVar29,auVar30);
          auVar156 = vunpcklpd_avx(auVar155,auVar157);
          auVar155 = vunpckhpd_avx(auVar155,auVar157);
          auVar157 = vunpcklpd_avx(auVar103,auVar158);
          auVar103 = vunpckhpd_avx(auVar103,auVar158);
          *pauVar134 = auVar105;
          pauVar134[1] = auVar153;
          pauVar134[2] = auVar156;
          pauVar134[4] = auVar149;
          pauVar134[5] = auVar150;
          pauVar134[6] = auVar155;
          pauVar134[8] = auVar152;
          pauVar134[9] = auVar154;
          pauVar134[10] = auVar157;
          pauVar134[0xc] = auVar104;
          pauVar134[0xd] = auVar151;
          pauVar134[0xe] = auVar103;
          topT = (Mat *)&topT[2].h;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar142);
          iVar121 = iVar131 + 0x17;
          iVar131 = iVar131 + 0xc;
        }
        iVar121 = iVar131 + 7;
        while (iVar121 < max_jj) {
          auVar31._0_8_ = topT->data;
          auVar31._8_8_ = topT->refcount;
          auVar32._0_8_ = topT->elemsize;
          auVar32._8_4_ = topT->elempack;
          auVar32._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar33._0_8_ = topT->allocator;
          auVar33._8_4_ = topT->dims;
          auVar33._12_4_ = topT->w;
          auVar34._0_4_ = topT->h;
          auVar34._4_4_ = topT->d;
          auVar34._8_4_ = topT->c;
          auVar34._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar35._0_8_ = topT[1].refcount;
          auVar35._8_8_ = topT[1].elemsize;
          auVar36._0_4_ = topT[1].elempack;
          auVar36._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar36._8_8_ = topT[1].allocator;
          auVar37._0_4_ = topT[1].dims;
          auVar37._4_4_ = topT[1].w;
          auVar37._8_4_ = topT[1].h;
          auVar37._12_4_ = topT[1].d;
          auVar149 = vunpcklps_avx(auVar31,auVar32);
          auVar151 = vunpcklps_avx(auVar33,auVar34);
          auVar104 = vunpckhps_avx(auVar31,auVar32);
          auVar150 = vunpckhps_avx(auVar33,auVar34);
          auVar103 = vunpcklpd_avx(auVar149,auVar151);
          auVar149 = vunpckhpd_avx(auVar149,auVar151);
          auVar158 = vunpcklpd_avx(auVar104,auVar150);
          auVar104 = vunpckhpd_avx(auVar104,auVar150);
          auVar150 = vunpcklps_avx(*(undefined1 (*) [16])&topT->cstep,auVar35);
          auVar152 = vunpcklps_avx(auVar36,auVar37);
          auVar151 = vunpckhps_avx(*(undefined1 (*) [16])&topT->cstep,auVar35);
          auVar155 = vunpckhps_avx(auVar36,auVar37);
          auVar105 = vunpcklpd_avx(auVar150,auVar152);
          auVar150 = vunpckhpd_avx(auVar150,auVar152);
          auVar152 = vunpcklpd_avx(auVar151,auVar155);
          auVar151 = vunpckhpd_avx(auVar151,auVar155);
          *pauVar134 = auVar103;
          pauVar134[1] = auVar105;
          pauVar134[4] = auVar149;
          pauVar134[5] = auVar150;
          pauVar134[8] = auVar158;
          pauVar134[9] = auVar152;
          pauVar134[0xc] = auVar104;
          pauVar134[0xd] = auVar151;
          topT = (Mat *)&topT[1].c;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar142);
          iVar121 = iVar131 + 0xf;
          iVar131 = iVar131 + 8;
        }
        iVar131 = iVar131 + 3;
        if (iVar131 < max_jj) {
          pauVar134 = pauVar134 + 0xc;
          do {
            auVar38._0_8_ = topT->data;
            auVar38._8_8_ = topT->refcount;
            auVar39._0_8_ = topT->elemsize;
            auVar39._8_4_ = topT->elempack;
            auVar39._12_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar40._0_8_ = topT->allocator;
            auVar40._8_4_ = topT->dims;
            auVar40._12_4_ = topT->w;
            auVar41._0_4_ = topT->h;
            auVar41._4_4_ = topT->d;
            auVar41._8_4_ = topT->c;
            auVar41._12_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar149 = vunpcklps_avx(auVar38,auVar39);
            auVar155 = vunpcklps_avx(auVar40,auVar41);
            auVar104 = vunpckhps_avx(auVar38,auVar39);
            auVar150 = vunpckhps_avx(auVar40,auVar41);
            auVar151 = vunpcklpd_avx(auVar149,auVar155);
            auVar149 = vunpckhpd_avx(auVar149,auVar155);
            auVar155 = vunpcklpd_avx(auVar104,auVar150);
            auVar104 = vunpckhpd_avx(auVar104,auVar150);
            pauVar134[-0xc] = auVar151;
            pauVar134[-8] = auVar149;
            pauVar134[-4] = auVar155;
            *pauVar134 = auVar104;
            topT = (Mat *)&topT->cstep;
            pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar142);
            iVar131 = iVar131 + 4;
          } while (iVar131 < max_jj);
        }
      }
      if (iVar101 == 8) {
        pauVar134 = (undefined1 (*) [16])
                    ((long)top_blob->data +
                    (lVar147 + uVar135) * 0x20 + (long)(int)((uVar130 >> 3) * iVar129) * 4);
        uVar122 = 0;
        if ((j & 0x80000007U) == 4) {
          auVar42._0_8_ = topT->data;
          auVar42._8_8_ = topT->refcount;
          auVar43._0_8_ = topT->elemsize;
          auVar43._8_4_ = topT->elempack;
          auVar43._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar44._0_8_ = topT->allocator;
          auVar44._8_4_ = topT->dims;
          auVar44._12_4_ = topT->w;
          auVar45._0_4_ = topT->h;
          auVar45._4_4_ = topT->d;
          auVar45._8_4_ = topT->c;
          auVar45._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar149 = vunpcklps_avx(auVar42,auVar43);
          auVar155 = vunpcklps_avx(auVar44,auVar45);
          auVar104 = vunpckhps_avx(auVar42,auVar43);
          auVar150 = vunpckhps_avx(auVar44,auVar45);
          auVar151 = vunpcklpd_avx(auVar149,auVar155);
          auVar149 = vunpckhpd_avx(auVar149,auVar155);
          auVar155 = vunpcklpd_avx(auVar104,auVar150);
          auVar104 = vunpckhpd_avx(auVar104,auVar150);
          pauVar134[1] = auVar151;
          pauVar134[3] = auVar149;
          pauVar134[5] = auVar155;
          pauVar134[7] = auVar104;
          topT = (Mat *)&topT->cstep;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + (long)iVar129 * 4);
          uVar122 = 4;
        }
        iVar131 = uVar122 + 7;
        while (iVar131 < max_jj) {
          auVar46._0_8_ = topT->data;
          auVar46._8_8_ = topT->refcount;
          auVar47._0_8_ = topT->elemsize;
          auVar47._8_4_ = topT->elempack;
          auVar47._12_4_ = *(undefined4 *)&topT->field_0x1c;
          auVar48._0_8_ = topT->allocator;
          auVar48._8_4_ = topT->dims;
          auVar48._12_4_ = topT->w;
          auVar49._0_4_ = topT->h;
          auVar49._4_4_ = topT->d;
          auVar49._8_4_ = topT->c;
          auVar49._12_4_ = *(undefined4 *)&topT->field_0x3c;
          auVar50._0_8_ = topT[1].refcount;
          auVar50._8_8_ = topT[1].elemsize;
          auVar51._0_4_ = topT[1].elempack;
          auVar51._4_4_ = *(undefined4 *)&topT[1].field_0x1c;
          auVar51._8_8_ = topT[1].allocator;
          auVar52._0_4_ = topT[1].dims;
          auVar52._4_4_ = topT[1].w;
          auVar52._8_4_ = topT[1].h;
          auVar52._12_4_ = topT[1].d;
          auVar149 = vunpcklps_avx(auVar46,auVar47);
          auVar151 = vunpcklps_avx(auVar48,auVar49);
          auVar104 = vunpckhps_avx(auVar46,auVar47);
          auVar150 = vunpckhps_avx(auVar48,auVar49);
          auVar103 = vunpcklpd_avx(auVar149,auVar151);
          auVar149 = vunpckhpd_avx(auVar149,auVar151);
          auVar158 = vunpcklpd_avx(auVar104,auVar150);
          auVar104 = vunpckhpd_avx(auVar104,auVar150);
          auVar150 = vunpcklps_avx(*(undefined1 (*) [16])&topT->cstep,auVar50);
          auVar152 = vunpcklps_avx(auVar51,auVar52);
          auVar151 = vunpckhps_avx(*(undefined1 (*) [16])&topT->cstep,auVar50);
          auVar155 = vunpckhps_avx(auVar51,auVar52);
          auVar105 = vunpcklpd_avx(auVar150,auVar152);
          auVar150 = vunpckhpd_avx(auVar150,auVar152);
          auVar152 = vunpcklpd_avx(auVar151,auVar155);
          auVar151 = vunpckhpd_avx(auVar151,auVar155);
          *pauVar134 = auVar103;
          pauVar134[1] = auVar105;
          pauVar134[2] = auVar149;
          pauVar134[3] = auVar150;
          pauVar134[4] = auVar158;
          pauVar134[5] = auVar152;
          pauVar134[6] = auVar104;
          pauVar134[7] = auVar151;
          topT = (Mat *)&topT[1].c;
          pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar144);
          iVar131 = uVar122 + 0xf;
          uVar122 = uVar122 + 8;
        }
        uVar122 = uVar122 | 3;
        if ((int)uVar122 < max_jj) {
          pauVar134 = pauVar134 + 6;
          do {
            auVar53._0_8_ = topT->data;
            auVar53._8_8_ = topT->refcount;
            auVar54._0_8_ = topT->elemsize;
            auVar54._8_4_ = topT->elempack;
            auVar54._12_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar55._0_8_ = topT->allocator;
            auVar55._8_4_ = topT->dims;
            auVar55._12_4_ = topT->w;
            auVar56._0_4_ = topT->h;
            auVar56._4_4_ = topT->d;
            auVar56._8_4_ = topT->c;
            auVar56._12_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar149 = vunpcklps_avx(auVar53,auVar54);
            auVar155 = vunpcklps_avx(auVar55,auVar56);
            auVar104 = vunpckhps_avx(auVar53,auVar54);
            auVar150 = vunpckhps_avx(auVar55,auVar56);
            auVar151 = vunpcklpd_avx(auVar149,auVar155);
            auVar149 = vunpckhpd_avx(auVar149,auVar155);
            auVar155 = vunpcklpd_avx(auVar104,auVar150);
            auVar104 = vunpckhpd_avx(auVar104,auVar150);
            pauVar134[-6] = auVar151;
            pauVar134[-4] = auVar149;
            pauVar134[-2] = auVar155;
            *pauVar134 = auVar104;
            topT = (Mat *)&topT->cstep;
            pauVar134 = (undefined1 (*) [16])(*pauVar134 + lVar144);
            uVar122 = uVar122 + 4;
          } while ((int)uVar122 < max_jj);
        }
      }
      if (iVar101 == 4) {
        if (3 < max_jj) {
          pauVar134 = (undefined1 (*) [16])((long)top_blob->data + lVar141);
          iVar131 = 3;
          do {
            auVar57._0_8_ = topT->data;
            auVar57._8_8_ = topT->refcount;
            auVar58._0_8_ = topT->elemsize;
            auVar58._8_4_ = topT->elempack;
            auVar58._12_4_ = *(undefined4 *)&topT->field_0x1c;
            auVar59._0_8_ = topT->allocator;
            auVar59._8_4_ = topT->dims;
            auVar59._12_4_ = topT->w;
            auVar60._0_4_ = topT->h;
            auVar60._4_4_ = topT->d;
            auVar60._8_4_ = topT->c;
            auVar60._12_4_ = *(undefined4 *)&topT->field_0x3c;
            auVar149 = vunpcklps_avx(auVar57,auVar58);
            auVar155 = vunpcklps_avx(auVar59,auVar60);
            auVar104 = vunpckhps_avx(auVar57,auVar58);
            auVar150 = vunpckhps_avx(auVar59,auVar60);
            auVar151 = vunpcklpd_avx(auVar149,auVar155);
            auVar149 = vunpckhpd_avx(auVar149,auVar155);
            auVar155 = vunpcklpd_avx(auVar104,auVar150);
            auVar104 = vunpckhpd_avx(auVar104,auVar150);
            pauVar134[-3] = auVar151;
            pauVar134[-2] = auVar149;
            pauVar134[-1] = auVar155;
            *pauVar134 = auVar104;
            topT = (Mat *)&topT->cstep;
            iVar131 = iVar131 + 4;
            pauVar134 = (undefined1 (*) [16])(*pauVar134 + (long)(iVar102 * 4) * 4);
          } while (iVar131 < max_jj);
          goto LAB_004bb064;
        }
      }
      else {
LAB_004bb064:
        if (0 < max_jj && iVar101 == 1) {
          pauVar134 = (undefined1 (*) [16])((long)top_blob->data + lVar148);
          iVar131 = max_jj;
          do {
            *pauVar134 = *(undefined1 (*) [16])topT;
            topT = (Mat *)&topT->elemsize;
            pauVar134 = (undefined1 (*) [16])(*pauVar134 + (long)iVar102 * 4);
            iVar131 = iVar131 + -1;
          } while (iVar131 != 0);
        }
      }
      uVar132 = uVar135 + 4;
      lVar126 = uVar135 + 7;
      lVar141 = lVar141 + 0x40;
      lVar148 = lVar148 + 0x10;
      uVar135 = uVar132;
    } while (lVar126 < max_ii);
  }
  if ((int)((uint)uVar132 | 1) < max_ii) {
    iVar129 = iVar102 * 8;
    iVar138 = iVar102 * 0x10;
    uVar130 = j + 7;
    iVar123 = j + 0xf;
    if (-1 < j) {
      uVar130 = j;
      iVar123 = j;
    }
    iVar131 = j % 0x10;
    uVar135 = (ulong)(int)(uint)uVar132;
    lVar142 = (long)i;
    lVar144 = (lVar142 + uVar135) * 0x10 + (long)(iVar102 * j) * 4 + 0x1c;
    lVar148 = lVar142 * 4 + uVar135 * 4 + (long)(iVar102 * j) * 4 + 4;
    do {
      if (iVar101 == 0x10) {
        puVar136 = (undefined4 *)
                   ((long)top_blob->data +
                   (uVar135 + lVar142) * 0x40 + (long)((iVar123 >> 4) * iVar138) * 4);
        if (iVar131 == 0xc) {
          local_98 = 0xc;
          iVar121 = 4;
          local_90 = 0x20;
          local_50 = 0x1c;
          local_58 = 0x14;
          local_78 = 4;
          lVar147 = 0x3c;
          local_68 = 0x18;
          local_100 = 0x38;
          local_80 = 0x10;
          lVar145 = 0x34;
          local_70 = 8;
          lVar141 = 0x30;
          pMVar128 = topT;
LAB_004bb4ad:
          *(undefined4 *)((long)puVar136 + lVar141) = *(undefined4 *)&pMVar128->data;
          *(undefined4 *)((long)puVar136 + lVar145) = *(undefined4 *)((long)&topT->data + local_70);
          *(undefined4 *)((long)puVar136 + local_100) =
               *(undefined4 *)((long)&topT->data + local_80);
          *(undefined4 *)((long)puVar136 + lVar147) = *(undefined4 *)((long)&topT->data + local_68);
          local_100 = 0x7c;
          lVar141 = 0x78;
          lVar147 = 0x74;
          lVar145 = 0x70;
LAB_004bb510:
          *(undefined4 *)((long)puVar136 + lVar145) = *(undefined4 *)((long)&topT->data + local_78);
          *(undefined4 *)((long)puVar136 + lVar147) = *(undefined4 *)((long)&topT->data + local_98);
          *(undefined4 *)((long)puVar136 + lVar141) = *(undefined4 *)((long)&topT->data + local_58);
          *(undefined4 *)((long)puVar136 + local_100) =
               *(undefined4 *)((long)&topT->data + local_50);
          topT = (Mat *)((long)&topT->data + local_90);
          puVar136 = puVar136 + iVar138;
        }
        else {
          if (iVar131 == 8) {
            puVar136[8] = *(undefined4 *)&topT->data;
            puVar136[9] = *(undefined4 *)&topT->refcount;
            puVar136[10] = (int)topT->elemsize;
            puVar136[0xb] = topT->elempack;
            local_68 = 0x1c;
            lVar126 = 4;
            lVar141 = 0x20;
            if (4 < max_jj) {
              local_80 = 0x14;
              local_70 = 0xc;
              iVar121 = 8;
              local_90 = 0x40;
              local_98 = 0x2c;
              local_78 = 0x24;
              local_50 = 0x3c;
              local_58 = 0x34;
              lVar140 = 0x28;
              lVar147 = 0x30;
              lVar145 = 0x30;
              lVar146 = 0x38;
              local_100 = 0x38;
LAB_004bb3cf:
              *(undefined4 *)((long)puVar136 + lVar147) =
                   *(undefined4 *)((long)&topT->data + lVar141);
              *(undefined4 *)((long)puVar136 + local_58) =
                   *(undefined4 *)((long)&topT->data + lVar140);
              *(undefined4 *)((long)puVar136 + lVar146) =
                   *(undefined4 *)((long)&topT->data + lVar145);
              *(undefined4 *)((long)puVar136 + local_50) =
                   *(undefined4 *)((long)&topT->data + local_100);
              lVar147 = 0x6c;
              local_100 = 0x68;
              lVar145 = 100;
              lVar141 = 0x60;
              pMVar128 = (Mat *)((long)&topT->data + lVar126);
              goto LAB_004bb4ad;
            }
            iVar121 = 4;
            local_100 = 0x6c;
            lVar141 = 0x68;
            local_78 = 4;
            local_98 = 0xc;
            local_90 = 0x20;
            lVar147 = 100;
            lVar145 = 0x60;
            local_58 = 0x14;
            local_50 = 0x1c;
            goto LAB_004bb510;
          }
          iVar121 = 0;
          if (iVar131 == 4) {
            puVar136[4] = *(undefined4 *)&topT->data;
            puVar136[5] = *(undefined4 *)&topT->refcount;
            puVar136[6] = (int)topT->elemsize;
            puVar136[7] = topT->elempack;
            if (4 < max_jj) {
              puVar136[8] = *(undefined4 *)&topT->allocator;
              puVar136[9] = topT->dims;
              puVar136[10] = topT->h;
              puVar136[0xb] = topT->c;
              puVar136[0xc] = (int)topT->cstep;
              puVar136[0xd] = *(undefined4 *)&topT[1].data;
              puVar136[0xe] = *(undefined4 *)&topT[1].refcount;
              puVar136[0xf] = (int)topT[1].elemsize;
              iVar121 = 0xc;
              local_90 = 0x60;
              local_98 = 0x4c;
              local_78 = 0x44;
              local_68 = 0x3c;
              local_80 = 0x34;
              local_70 = 0x2c;
              lVar126 = 0x24;
              local_50 = 0x5c;
              local_100 = 0x1c;
              lVar146 = 0x58;
              lVar145 = 0x14;
              local_58 = 0x54;
              lVar140 = 0xc;
              lVar147 = 0x50;
              lVar141 = 4;
              goto LAB_004bb3cf;
            }
            iVar121 = 4;
            local_90 = 0x20;
            local_100 = 0x5c;
            local_50 = 0x1c;
            lVar141 = 0x58;
            local_58 = 0x14;
            lVar147 = 0x54;
            local_98 = 0xc;
            lVar145 = 0x50;
            local_78 = 4;
            goto LAB_004bb510;
          }
        }
        iVar124 = iVar121 + 0xf;
        while (iVar124 < max_jj) {
          *puVar136 = *(undefined4 *)&topT->data;
          puVar136[1] = *(undefined4 *)&topT->refcount;
          puVar136[2] = (int)topT->elemsize;
          puVar136[3] = topT->elempack;
          puVar136[4] = *(undefined4 *)&topT->allocator;
          puVar136[5] = topT->dims;
          puVar136[6] = topT->h;
          puVar136[7] = topT->c;
          puVar136[8] = (int)topT->cstep;
          puVar136[9] = *(undefined4 *)&topT[1].data;
          puVar136[10] = *(undefined4 *)&topT[1].refcount;
          puVar136[0xb] = (int)topT[1].elemsize;
          puVar136[0xc] = topT[1].elempack;
          puVar136[0xd] = *(undefined4 *)&topT[1].allocator;
          puVar136[0xe] = topT[1].dims;
          puVar136[0xf] = topT[1].h;
          puVar136[0x10] = *(undefined4 *)((long)&topT->data + 4);
          puVar136[0x11] = *(undefined4 *)((long)&topT->refcount + 4);
          puVar136[0x12] = *(undefined4 *)((long)&topT->elemsize + 4);
          puVar136[0x13] = *(undefined4 *)&topT->field_0x1c;
          puVar136[0x14] = *(undefined4 *)((long)&topT->allocator + 4);
          puVar136[0x15] = topT->w;
          puVar136[0x16] = topT->d;
          puVar136[0x17] = *(undefined4 *)&topT->field_0x3c;
          puVar136[0x18] = *(undefined4 *)((long)&topT->cstep + 4);
          puVar136[0x19] = *(undefined4 *)((long)&topT[1].data + 4);
          puVar136[0x1a] = *(undefined4 *)((long)&topT[1].refcount + 4);
          puVar136[0x1b] = *(undefined4 *)((long)&topT[1].elemsize + 4);
          puVar136[0x1c] = *(undefined4 *)&topT[1].field_0x1c;
          puVar136[0x1d] = *(undefined4 *)((long)&topT[1].allocator + 4);
          puVar136[0x1e] = topT[1].w;
          puVar136[0x1f] = topT[1].d;
          topT = (Mat *)&topT[1].c;
          puVar136 = puVar136 + iVar138;
          iVar124 = iVar121 + 0x1f;
          iVar121 = iVar121 + 0x10;
        }
        iVar124 = iVar121 + 0xb;
        while (iVar124 < max_jj) {
          *puVar136 = *(undefined4 *)&topT->data;
          puVar136[1] = *(undefined4 *)&topT->refcount;
          puVar136[2] = (int)topT->elemsize;
          puVar136[3] = topT->elempack;
          puVar136[4] = *(undefined4 *)&topT->allocator;
          puVar136[5] = topT->dims;
          puVar136[6] = topT->h;
          puVar136[7] = topT->c;
          puVar136[8] = (int)topT->cstep;
          puVar136[9] = *(undefined4 *)&topT[1].data;
          puVar136[10] = *(undefined4 *)&topT[1].refcount;
          puVar136[0xb] = (int)topT[1].elemsize;
          puVar136[0x10] = *(undefined4 *)((long)&topT->data + 4);
          puVar136[0x11] = *(undefined4 *)((long)&topT->refcount + 4);
          puVar136[0x12] = *(undefined4 *)((long)&topT->elemsize + 4);
          puVar136[0x13] = *(undefined4 *)&topT->field_0x1c;
          puVar136[0x14] = *(undefined4 *)((long)&topT->allocator + 4);
          puVar136[0x15] = topT->w;
          puVar136[0x16] = topT->d;
          puVar136[0x17] = *(undefined4 *)&topT->field_0x3c;
          puVar136[0x18] = *(undefined4 *)((long)&topT->cstep + 4);
          puVar136[0x19] = *(undefined4 *)((long)&topT[1].data + 4);
          puVar136[0x1a] = *(undefined4 *)((long)&topT[1].refcount + 4);
          puVar136[0x1b] = *(undefined4 *)((long)&topT[1].elemsize + 4);
          topT = (Mat *)&topT[1].elempack;
          puVar136 = puVar136 + iVar138;
          iVar124 = iVar121 + 0x17;
          iVar121 = iVar121 + 0xc;
        }
        iVar124 = iVar121 + 7;
        while (iVar124 < max_jj) {
          *puVar136 = *(undefined4 *)&topT->data;
          puVar136[1] = *(undefined4 *)&topT->refcount;
          puVar136[2] = (int)topT->elemsize;
          puVar136[3] = topT->elempack;
          puVar136[4] = *(undefined4 *)&topT->allocator;
          puVar136[5] = topT->dims;
          puVar136[6] = topT->h;
          puVar136[7] = topT->c;
          puVar136[0x10] = *(undefined4 *)((long)&topT->data + 4);
          puVar136[0x11] = *(undefined4 *)((long)&topT->refcount + 4);
          puVar136[0x12] = *(undefined4 *)((long)&topT->elemsize + 4);
          puVar136[0x13] = *(undefined4 *)&topT->field_0x1c;
          puVar136[0x14] = *(undefined4 *)((long)&topT->allocator + 4);
          puVar136[0x15] = topT->w;
          puVar136[0x16] = topT->d;
          puVar136[0x17] = *(undefined4 *)&topT->field_0x3c;
          topT = (Mat *)&topT->cstep;
          puVar136 = puVar136 + iVar138;
          iVar124 = iVar121 + 0xf;
          iVar121 = iVar121 + 8;
        }
        iVar121 = iVar121 + 3;
        if (iVar121 < max_jj) {
          puVar136 = puVar136 + 0x13;
          do {
            puVar136[-0x13] = *(undefined4 *)&topT->data;
            puVar136[-0x12] = *(undefined4 *)&topT->refcount;
            puVar136[-0x11] = (int)topT->elemsize;
            puVar136[-0x10] = topT->elempack;
            puVar136[-3] = *(undefined4 *)((long)&topT->data + 4);
            puVar136[-2] = *(undefined4 *)((long)&topT->refcount + 4);
            puVar136[-1] = *(undefined4 *)((long)&topT->elemsize + 4);
            *puVar136 = *(undefined4 *)&topT->field_0x1c;
            topT = (Mat *)&topT->allocator;
            iVar121 = iVar121 + 4;
            puVar136 = puVar136 + iVar138;
          } while (iVar121 < max_jj);
        }
      }
      if (iVar101 == 8) {
        puVar136 = (undefined4 *)
                   ((long)top_blob->data +
                   (lVar142 + uVar135) * 0x20 + (long)(int)((uVar130 >> 3) * iVar129) * 4);
        uVar122 = 0;
        if ((j & 0x80000007U) == 4) {
          puVar136[4] = *(undefined4 *)&topT->data;
          puVar136[5] = *(undefined4 *)&topT->refcount;
          puVar136[6] = (int)topT->elemsize;
          puVar136[7] = topT->elempack;
          puVar136[0xc] = *(undefined4 *)((long)&topT->data + 4);
          puVar136[0xd] = *(undefined4 *)((long)&topT->refcount + 4);
          puVar136[0xe] = *(undefined4 *)((long)&topT->elemsize + 4);
          puVar136[0xf] = *(undefined4 *)&topT->field_0x1c;
          topT = (Mat *)&topT->allocator;
          puVar136 = puVar136 + iVar129;
          uVar122 = 4;
        }
        iVar121 = uVar122 + 7;
        while (iVar121 < max_jj) {
          *puVar136 = *(undefined4 *)&topT->data;
          puVar136[1] = *(undefined4 *)&topT->refcount;
          puVar136[2] = (int)topT->elemsize;
          puVar136[3] = topT->elempack;
          puVar136[4] = *(undefined4 *)&topT->allocator;
          puVar136[5] = topT->dims;
          puVar136[6] = topT->h;
          puVar136[7] = topT->c;
          puVar136[8] = *(undefined4 *)((long)&topT->data + 4);
          puVar136[9] = *(undefined4 *)((long)&topT->refcount + 4);
          puVar136[10] = *(undefined4 *)((long)&topT->elemsize + 4);
          puVar136[0xb] = *(undefined4 *)&topT->field_0x1c;
          puVar136[0xc] = *(undefined4 *)((long)&topT->allocator + 4);
          puVar136[0xd] = topT->w;
          puVar136[0xe] = topT->d;
          puVar136[0xf] = *(undefined4 *)&topT->field_0x3c;
          topT = (Mat *)&topT->cstep;
          puVar136 = puVar136 + iVar129;
          iVar121 = uVar122 + 0xf;
          uVar122 = uVar122 + 8;
        }
        uVar122 = uVar122 | 3;
        if ((int)uVar122 < max_jj) {
          puVar136 = puVar136 + 0xb;
          do {
            puVar136[-0xb] = *(undefined4 *)&topT->data;
            puVar136[-10] = *(undefined4 *)&topT->refcount;
            puVar136[-9] = (int)topT->elemsize;
            puVar136[-8] = topT->elempack;
            puVar136[-3] = *(undefined4 *)((long)&topT->data + 4);
            puVar136[-2] = *(undefined4 *)((long)&topT->refcount + 4);
            puVar136[-1] = *(undefined4 *)((long)&topT->elemsize + 4);
            *puVar136 = *(undefined4 *)&topT->field_0x1c;
            topT = (Mat *)&topT->allocator;
            uVar122 = uVar122 + 4;
            puVar136 = puVar136 + iVar129;
          } while ((int)uVar122 < max_jj);
        }
      }
      if (iVar101 == 4) {
        if (3 < max_jj) {
          puVar136 = (undefined4 *)((long)top_blob->data + lVar144);
          iVar121 = 3;
          do {
            puVar136[-7] = *(undefined4 *)&topT->data;
            puVar136[-6] = *(undefined4 *)&topT->refcount;
            puVar136[-5] = (int)topT->elemsize;
            puVar136[-4] = topT->elempack;
            puVar136[-3] = *(undefined4 *)((long)&topT->data + 4);
            puVar136[-2] = *(undefined4 *)((long)&topT->refcount + 4);
            puVar136[-1] = *(undefined4 *)((long)&topT->elemsize + 4);
            *puVar136 = *(undefined4 *)&topT->field_0x1c;
            topT = (Mat *)&topT->allocator;
            iVar121 = iVar121 + 4;
            puVar136 = puVar136 + iVar102 * 4;
          } while (iVar121 < max_jj);
          goto LAB_004bbb63;
        }
      }
      else {
LAB_004bbb63:
        if (0 < max_jj && iVar101 == 1) {
          puVar136 = (undefined4 *)((long)top_blob->data + lVar148);
          iVar121 = max_jj;
          do {
            puVar136[-1] = *(undefined4 *)&topT->data;
            *puVar136 = *(undefined4 *)((long)&topT->data + 4);
            topT = (Mat *)&topT->refcount;
            puVar136 = puVar136 + iVar102;
            iVar121 = iVar121 + -1;
          } while (iVar121 != 0);
        }
      }
      uVar132 = uVar135 + 2;
      lVar141 = uVar135 + 3;
      lVar144 = lVar144 + 0x20;
      lVar148 = lVar148 + 8;
      uVar135 = uVar132;
    } while (lVar141 < max_ii);
  }
  if ((int)uVar132 < max_ii) {
    uVar122 = j + 7;
    uVar130 = j + 0xf;
    if (-1 < j) {
      uVar122 = j;
      uVar130 = j;
    }
    iVar123 = j - (uVar130 & 0xfffffff0);
    lVar141 = (long)(iVar102 * 0x10);
    lVar145 = (long)(iVar102 * 8);
    lVar126 = (long)(int)uVar132;
    lVar147 = (long)i;
    lVar144 = lVar141 * 4;
    lVar148 = (lVar126 + lVar147) * 0x10 + (long)(iVar102 * j) * 4;
    lVar142 = lVar147 * 4 + lVar126 * 4 + (long)(iVar102 * j) * 4;
    do {
      if (iVar101 == 0x10) {
        puVar137 = (undefined8 *)
                   ((long)top_blob->data +
                   (lVar126 + lVar147) * 0x40 + (long)(((int)uVar130 >> 4) * iVar102 * 0x10) * 4);
        if (iVar123 == 0xc) {
          piVar116 = topT->refcount;
          puVar137[6] = topT->data;
          puVar137[7] = piVar116;
          topT = (Mat *)&topT->elemsize;
          puVar137 = (undefined8 *)((long)puVar137 + lVar141 * 4);
          iVar129 = 4;
        }
        else {
          if (iVar123 == 8) {
            if (max_jj < 5) {
              piVar116 = topT->refcount;
              puVar137[4] = topT->data;
              puVar137[5] = piVar116;
LAB_004bbde4:
              iVar129 = 4;
              lVar140 = 0x10;
            }
            else {
              piVar116 = topT->refcount;
              sVar117 = topT->elemsize;
              uVar115 = *(undefined8 *)&topT->elempack;
              puVar137[4] = topT->data;
              puVar137[5] = piVar116;
              puVar137[6] = sVar117;
              puVar137[7] = uVar115;
              iVar129 = 8;
              lVar140 = 0x20;
            }
          }
          else {
            iVar129 = 0;
            if (iVar123 != 4) goto LAB_004bbdfb;
            if (max_jj < 5) {
              piVar116 = topT->refcount;
              puVar137[2] = topT->data;
              puVar137[3] = piVar116;
              goto LAB_004bbde4;
            }
            piVar116 = topT->refcount;
            sVar117 = topT->elemsize;
            uVar118 = *(undefined8 *)&topT->elempack;
            pAVar114 = topT->allocator;
            uVar115 = *(undefined8 *)&topT->dims;
            puVar137[2] = topT->data;
            puVar137[3] = piVar116;
            puVar137[4] = sVar117;
            puVar137[5] = uVar118;
            puVar137[6] = pAVar114;
            puVar137[7] = uVar115;
            iVar129 = 0xc;
            lVar140 = 0x30;
          }
          topT = (Mat *)((long)&topT->data + lVar140);
          puVar137 = (undefined8 *)((long)puVar137 + lVar141 * 4);
        }
LAB_004bbdfb:
        iVar138 = iVar129 + 0xf;
        while (iVar138 < max_jj) {
          piVar116 = topT->refcount;
          sVar117 = topT->elemsize;
          uVar115 = *(undefined8 *)&topT->elempack;
          pAVar114 = topT->allocator;
          uVar118 = *(undefined8 *)&topT->dims;
          uVar119 = *(undefined8 *)&topT->h;
          uVar120 = *(undefined8 *)&topT->c;
          *puVar137 = topT->data;
          puVar137[1] = piVar116;
          puVar137[2] = sVar117;
          puVar137[3] = uVar115;
          puVar137[4] = pAVar114;
          puVar137[5] = uVar118;
          puVar137[6] = uVar119;
          puVar137[7] = uVar120;
          topT = (Mat *)&topT->cstep;
          puVar137 = (undefined8 *)((long)puVar137 + lVar144);
          iVar138 = iVar129 + 0x1f;
          iVar129 = iVar129 + 0x10;
        }
        iVar138 = iVar129 + 0xb;
        while (iVar138 < max_jj) {
          piVar116 = topT->refcount;
          sVar117 = topT->elemsize;
          uVar118 = *(undefined8 *)&topT->elempack;
          pAVar114 = topT->allocator;
          uVar115 = *(undefined8 *)&topT->dims;
          *puVar137 = topT->data;
          puVar137[1] = piVar116;
          puVar137[2] = sVar117;
          puVar137[3] = uVar118;
          puVar137[4] = pAVar114;
          puVar137[5] = uVar115;
          topT = (Mat *)&topT->h;
          puVar137 = (undefined8 *)((long)puVar137 + lVar144);
          iVar138 = iVar129 + 0x17;
          iVar129 = iVar129 + 0xc;
        }
        iVar138 = iVar129 + 7;
        while (iVar138 < max_jj) {
          piVar116 = topT->refcount;
          sVar117 = topT->elemsize;
          uVar115 = *(undefined8 *)&topT->elempack;
          *puVar137 = topT->data;
          puVar137[1] = piVar116;
          puVar137[2] = sVar117;
          puVar137[3] = uVar115;
          topT = (Mat *)&topT->allocator;
          puVar137 = (undefined8 *)((long)puVar137 + lVar144);
          iVar138 = iVar129 + 0xf;
          iVar129 = iVar129 + 8;
        }
        for (iVar129 = iVar129 + 3; iVar129 < max_jj; iVar129 = iVar129 + 4) {
          piVar116 = topT->refcount;
          *puVar137 = topT->data;
          puVar137[1] = piVar116;
          topT = (Mat *)&topT->elemsize;
          puVar137 = (undefined8 *)((long)puVar137 + lVar144);
        }
      }
      if (iVar101 == 8) {
        puVar137 = (undefined8 *)
                   ((long)top_blob->data +
                   (lVar126 + lVar147) * 0x20 + (long)(int)((uVar122 >> 3) * iVar102 * 8) * 4);
        uVar139 = 0;
        if ((j & 0x80000007U) == 4) {
          *(undefined4 *)(puVar137 + 2) = *(undefined4 *)&topT->data;
          *(undefined4 *)((long)puVar137 + 0x14) = *(undefined4 *)((long)&topT->data + 4);
          *(undefined4 *)(puVar137 + 3) = *(undefined4 *)&topT->refcount;
          *(undefined4 *)((long)puVar137 + 0x1c) = *(undefined4 *)((long)&topT->refcount + 4);
          topT = (Mat *)&topT->elemsize;
          puVar137 = (undefined8 *)((long)puVar137 + lVar145 * 4);
          uVar139 = 4;
        }
        iVar129 = uVar139 + 7;
        while (iVar129 < max_jj) {
          piVar116 = topT->refcount;
          sVar117 = topT->elemsize;
          uVar115 = *(undefined8 *)&topT->elempack;
          *puVar137 = topT->data;
          puVar137[1] = piVar116;
          puVar137[2] = sVar117;
          puVar137[3] = uVar115;
          topT = (Mat *)&topT->allocator;
          puVar137 = (undefined8 *)((long)puVar137 + lVar145 * 4);
          iVar129 = uVar139 + 0xf;
          uVar139 = uVar139 + 8;
        }
        uVar139 = uVar139 | 3;
        if ((int)uVar139 < max_jj) {
          puVar136 = (undefined4 *)((long)puVar137 + 0xc);
          do {
            puVar136[-3] = *(undefined4 *)&topT->data;
            puVar136[-2] = *(undefined4 *)((long)&topT->data + 4);
            puVar136[-1] = *(undefined4 *)&topT->refcount;
            *puVar136 = *(undefined4 *)((long)&topT->refcount + 4);
            topT = (Mat *)&topT->elemsize;
            uVar139 = uVar139 + 4;
            puVar136 = puVar136 + lVar145;
          } while ((int)uVar139 < max_jj);
        }
      }
      if (iVar101 == 4) {
        if (3 < max_jj) {
          puVar137 = (undefined8 *)((long)top_blob->data + lVar148);
          iVar129 = 3;
          do {
            piVar116 = topT->refcount;
            *puVar137 = topT->data;
            puVar137[1] = piVar116;
            topT = (Mat *)&topT->elemsize;
            iVar129 = iVar129 + 4;
            puVar137 = (undefined8 *)((long)puVar137 + (long)(iVar102 * 4) * 4);
          } while (iVar129 < max_jj);
          goto LAB_004bbf9a;
        }
      }
      else {
LAB_004bbf9a:
        if (0 < max_jj && iVar101 == 1) {
          puVar136 = (undefined4 *)((long)top_blob->data + lVar142);
          iVar129 = max_jj;
          do {
            *puVar136 = *(undefined4 *)&topT->data;
            topT = (Mat *)((long)&topT->data + 4);
            puVar136 = puVar136 + iVar102;
            iVar129 = iVar129 + -1;
          } while (iVar129 != 0);
        }
      }
      lVar126 = lVar126 + 1;
      lVar148 = lVar148 + 0x10;
      lVar142 = lVar142 + 4;
    } while (lVar126 != max_ii);
  }
  return;
}

Assistant:

static void transpose_unpack_output_tile(const Mat& topT, Mat& top_blob, int i, int max_ii, int j, int max_jj)
{
    const int out_elempack = top_blob.elempack;
    const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

    const float* pp = topT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                    __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                    __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                    __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                    __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                    __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                    __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                    __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                    transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                    _mm256_storeu_ps(p0 + 4, _mm512_extractf32x8_ps(_r0, 0));
                    _mm_store_ps(p0 + 4 + 8, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 + 4, _mm512_extractf32x4_ps(_r0, 3));
                    _mm256_store_ps(p0 + 16 + 4 + 4, _mm512_extractf32x8_ps(_r1, 0));
                    _mm256_storeu_ps(p0 + 16 * 2 + 4, _mm512_extractf32x8_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4 + 8, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm512_extractf32x4_ps(_r2, 1));
                    _mm256_store_ps(p0 + 16 * 3 + 4 + 4, _mm512_extractf32x8_ps(_r2, 1));
                    _mm256_storeu_ps(p0 + 16 * 4 + 4, _mm512_extractf32x8_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 4 + 4 + 8, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm512_extractf32x4_ps(_r3, 3));
                    _mm256_store_ps(p0 + 16 * 5 + 4 + 4, _mm512_extractf32x8_ps(_r4, 0));
                    _mm256_storeu_ps(p0 + 16 * 6 + 4, _mm512_extractf32x8_ps(_r4, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4 + 8, _mm512_extractf32x4_ps(_r5, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm512_extractf32x4_ps(_r5, 1));
                    _mm256_store_ps(p0 + 16 * 7 + 4 + 4, _mm512_extractf32x8_ps(_r5, 1));
                    _mm256_storeu_ps(p0 + 16 * 8 + 4, _mm512_extractf32x8_ps(_r6, 0));
                    _mm_store_ps(p0 + 16 * 8 + 4 + 8, _mm512_extractf32x4_ps(_r6, 2));
                    _mm_store_ps(p0 + 16 * 9 + 4, _mm512_extractf32x4_ps(_r6, 3));
                    _mm256_store_ps(p0 + 16 * 9 + 4 + 4, _mm512_extractf32x8_ps(_r7, 0));
                    _mm256_storeu_ps(p0 + 16 * 10 + 4, _mm512_extractf32x8_ps(_r7, 1));
                    _mm_store_ps(p0 + 16 * 10 + 4 + 8, _mm512_extractf32x4_ps(_r8, 0));
                    _mm_store_ps(p0 + 16 * 11 + 4, _mm512_extractf32x4_ps(_r8, 1));
                    _mm256_store_ps(p0 + 16 * 11 + 4 + 4, _mm512_extractf32x8_ps(_r8, 1));
                    _mm256_storeu_ps(p0 + 16 * 12 + 4, _mm512_extractf32x8_ps(_r9, 0));
                    _mm_store_ps(p0 + 16 * 12 + 4 + 8, _mm512_extractf32x4_ps(_r9, 2));
                    _mm_store_ps(p0 + 16 * 13 + 4, _mm512_extractf32x4_ps(_r9, 3));
                    _mm256_store_ps(p0 + 16 * 13 + 4 + 4, _mm512_extractf32x8_ps(_ra, 0));
                    _mm256_storeu_ps(p0 + 16 * 14 + 4, _mm512_extractf32x8_ps(_ra, 1));
                    _mm_store_ps(p0 + 16 * 14 + 4 + 8, _mm512_extractf32x4_ps(_rb, 0));
                    _mm_store_ps(p0 + 16 * 15 + 4, _mm512_extractf32x4_ps(_rb, 1));
                    _mm256_store_ps(p0 + 16 * 15 + 4 + 4, _mm512_extractf32x8_ps(_rb, 1));
                    pp += 192;
                    jj += 12;
                }
                else
                {
                    transpose16x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _mm512_extractf32x4_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm512_extractf32x4_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm512_extractf32x4_ps(_r0, 3));
                    _mm_store_ps(p0 + 16 * 4 + 4, _mm512_extractf32x4_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm512_extractf32x4_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4, _mm512_extractf32x4_ps(_r1, 2));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm512_extractf32x4_ps(_r1, 3));
                    _mm_store_ps(p0 + 16 * 8 + 4, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 9 + 4, _mm512_extractf32x4_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 10 + 4, _mm512_extractf32x4_ps(_r2, 2));
                    _mm_store_ps(p0 + 16 * 11 + 4, _mm512_extractf32x4_ps(_r2, 3));
                    _mm_store_ps(p0 + 16 * 12 + 4, _mm512_extractf32x4_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 13 + 4, _mm512_extractf32x4_ps(_r3, 1));
                    _mm_store_ps(p0 + 16 * 14 + 4, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 15 + 4, _mm512_extractf32x4_ps(_r3, 3));
                    pp += 64;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                if (max_jj > 4)
                {
                    __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                    __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                    __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                    __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                    transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                    _mm256_store_ps(p0 + 8, _mm512_extractf32x8_ps(_r0, 0));
                    _mm256_store_ps(p0 + 16 + 8, _mm512_extractf32x8_ps(_r0, 1));
                    _mm256_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x8_ps(_r1, 0));
                    _mm256_store_ps(p0 + 16 * 3 + 8, _mm512_extractf32x8_ps(_r1, 1));
                    _mm256_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x8_ps(_r2, 0));
                    _mm256_store_ps(p0 + 16 * 5 + 8, _mm512_extractf32x8_ps(_r2, 1));
                    _mm256_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x8_ps(_r3, 0));
                    _mm256_store_ps(p0 + 16 * 7 + 8, _mm512_extractf32x8_ps(_r3, 1));
                    _mm256_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x8_ps(_r4, 0));
                    _mm256_store_ps(p0 + 16 * 9 + 8, _mm512_extractf32x8_ps(_r4, 1));
                    _mm256_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x8_ps(_r5, 0));
                    _mm256_store_ps(p0 + 16 * 11 + 8, _mm512_extractf32x8_ps(_r5, 1));
                    _mm256_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x8_ps(_r6, 0));
                    _mm256_store_ps(p0 + 16 * 13 + 8, _mm512_extractf32x8_ps(_r6, 1));
                    _mm256_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x8_ps(_r7, 0));
                    _mm256_store_ps(p0 + 16 * 15 + 8, _mm512_extractf32x8_ps(_r7, 1));
                    pp += 128;
                    jj += 8;
                }
                else
                {
                    transpose16x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 8, _mm512_extractf32x4_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x4_ps(_r0, 2));
                    _mm_store_ps(p0 + 16 * 3 + 8, _mm512_extractf32x4_ps(_r0, 3));
                    _mm_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x4_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 5 + 8, _mm512_extractf32x4_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x4_ps(_r1, 2));
                    _mm_store_ps(p0 + 16 * 7 + 8, _mm512_extractf32x4_ps(_r1, 3));
                    _mm_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x4_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 9 + 8, _mm512_extractf32x4_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x4_ps(_r2, 2));
                    _mm_store_ps(p0 + 16 * 11 + 8, _mm512_extractf32x4_ps(_r2, 3));
                    _mm_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x4_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 13 + 8, _mm512_extractf32x4_ps(_r3, 1));
                    _mm_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x4_ps(_r3, 2));
                    _mm_store_ps(p0 + 16 * 15 + 8, _mm512_extractf32x4_ps(_r3, 3));
                    pp += 64;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 16 + 12, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2 + 12, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16 * 3 + 12, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 16 * 4 + 12, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 5 + 12, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 6 + 12, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 16 * 7 + 12, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 16 * 8 + 12, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 9 + 12, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 10 + 12, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 16 * 11 + 12, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 16 * 12 + 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 13 + 12, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 16 * 14 + 12, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 15 + 12, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                __m512 _rc = _mm512_load_ps(pp + 16 * 12);
                __m512 _rd = _mm512_load_ps(pp + 16 * 13);
                __m512 _re = _mm512_load_ps(pp + 16 * 14);
                __m512 _rf = _mm512_load_ps(pp + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(p0, _r0);
                _mm512_store_ps(p0 + 16, _r1);
                _mm512_store_ps(p0 + 16 * 2, _r2);
                _mm512_store_ps(p0 + 16 * 3, _r3);
                _mm512_store_ps(p0 + 16 * 4, _r4);
                _mm512_store_ps(p0 + 16 * 5, _r5);
                _mm512_store_ps(p0 + 16 * 6, _r6);
                _mm512_store_ps(p0 + 16 * 7, _r7);
                _mm512_store_ps(p0 + 16 * 8, _r8);
                _mm512_store_ps(p0 + 16 * 9, _r9);
                _mm512_store_ps(p0 + 16 * 10, _ra);
                _mm512_store_ps(p0 + 16 * 11, _rb);
                _mm512_store_ps(p0 + 16 * 12, _rc);
                _mm512_store_ps(p0 + 16 * 13, _rd);
                _mm512_store_ps(p0 + 16 * 14, _re);
                _mm512_store_ps(p0 + 16 * 15, _rf);
                pp += 256;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                __m512 _r8 = _mm512_load_ps(pp + 16 * 8);
                __m512 _r9 = _mm512_load_ps(pp + 16 * 9);
                __m512 _ra = _mm512_load_ps(pp + 16 * 10);
                __m512 _rb = _mm512_load_ps(pp + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(p0, _mm512_extractf32x8_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16, _mm512_extractf32x4_ps(_r0, 3));
                _mm256_storeu_ps(p0 + 16 + 4, _mm512_extractf32x8_ps(_r1, 0));
                _mm256_store_ps(p0 + 16 * 2, _mm512_extractf32x8_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 2 + 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 3, _mm512_extractf32x4_ps(_r2, 1));
                _mm256_storeu_ps(p0 + 16 * 3 + 4, _mm512_extractf32x8_ps(_r2, 1));
                _mm256_store_ps(p0 + 16 * 4, _mm512_extractf32x8_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 4 + 8, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 5, _mm512_extractf32x4_ps(_r3, 3));
                _mm256_storeu_ps(p0 + 16 * 5 + 4, _mm512_extractf32x8_ps(_r4, 0));
                _mm256_store_ps(p0 + 16 * 6, _mm512_extractf32x8_ps(_r4, 1));
                _mm_store_ps(p0 + 16 * 6 + 8, _mm512_extractf32x4_ps(_r5, 0));
                _mm_store_ps(p0 + 16 * 7, _mm512_extractf32x4_ps(_r5, 1));
                _mm256_storeu_ps(p0 + 16 * 7 + 4, _mm512_extractf32x8_ps(_r5, 1));
                _mm256_store_ps(p0 + 16 * 8, _mm512_extractf32x8_ps(_r6, 0));
                _mm_store_ps(p0 + 16 * 8 + 8, _mm512_extractf32x4_ps(_r6, 2));
                _mm_store_ps(p0 + 16 * 9, _mm512_extractf32x4_ps(_r6, 3));
                _mm256_storeu_ps(p0 + 16 * 9 + 4, _mm512_extractf32x8_ps(_r7, 0));
                _mm256_store_ps(p0 + 16 * 10, _mm512_extractf32x8_ps(_r7, 1));
                _mm_store_ps(p0 + 16 * 10 + 8, _mm512_extractf32x4_ps(_r8, 0));
                _mm_store_ps(p0 + 16 * 11, _mm512_extractf32x4_ps(_r8, 1));
                _mm256_storeu_ps(p0 + 16 * 11 + 4, _mm512_extractf32x8_ps(_r8, 1));
                _mm256_store_ps(p0 + 16 * 12, _mm512_extractf32x8_ps(_r9, 0));
                _mm_store_ps(p0 + 16 * 12 + 8, _mm512_extractf32x4_ps(_r9, 2));
                _mm_store_ps(p0 + 16 * 13, _mm512_extractf32x4_ps(_r9, 3));
                _mm256_storeu_ps(p0 + 16 * 13 + 4, _mm512_extractf32x8_ps(_ra, 0));
                _mm256_store_ps(p0 + 16 * 14, _mm512_extractf32x8_ps(_ra, 1));
                _mm_store_ps(p0 + 16 * 14 + 8, _mm512_extractf32x4_ps(_rb, 0));
                _mm_store_ps(p0 + 16 * 15, _mm512_extractf32x4_ps(_rb, 1));
                _mm256_storeu_ps(p0 + 16 * 15 + 4, _mm512_extractf32x8_ps(_rb, 1));
                pp += 192;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(p0, _mm512_extractf32x8_ps(_r0, 0));
                _mm256_store_ps(p0 + 16, _mm512_extractf32x8_ps(_r0, 1));
                _mm256_store_ps(p0 + 16 * 2, _mm512_extractf32x8_ps(_r1, 0));
                _mm256_store_ps(p0 + 16 * 3, _mm512_extractf32x8_ps(_r1, 1));
                _mm256_store_ps(p0 + 16 * 4, _mm512_extractf32x8_ps(_r2, 0));
                _mm256_store_ps(p0 + 16 * 5, _mm512_extractf32x8_ps(_r2, 1));
                _mm256_store_ps(p0 + 16 * 6, _mm512_extractf32x8_ps(_r3, 0));
                _mm256_store_ps(p0 + 16 * 7, _mm512_extractf32x8_ps(_r3, 1));
                _mm256_store_ps(p0 + 16 * 8, _mm512_extractf32x8_ps(_r4, 0));
                _mm256_store_ps(p0 + 16 * 9, _mm512_extractf32x8_ps(_r4, 1));
                _mm256_store_ps(p0 + 16 * 10, _mm512_extractf32x8_ps(_r5, 0));
                _mm256_store_ps(p0 + 16 * 11, _mm512_extractf32x8_ps(_r5, 1));
                _mm256_store_ps(p0 + 16 * 12, _mm512_extractf32x8_ps(_r6, 0));
                _mm256_store_ps(p0 + 16 * 13, _mm512_extractf32x8_ps(_r6, 1));
                _mm256_store_ps(p0 + 16 * 14, _mm512_extractf32x8_ps(_r7, 0));
                _mm256_store_ps(p0 + 16 * 15, _mm512_extractf32x8_ps(_r7, 1));
                pp += 128;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 16, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 16 * 3, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 16 * 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 5, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 6, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 16 * 7, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 16 * 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 9, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 10, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 16 * 11, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 16 * 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 13, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 16 * 14, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 16 * 15, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 16;
            }
        }
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 8 + 4, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2 + 4, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 8 * 3 + 4, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 8 * 4 + 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 5 + 4, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 6 + 4, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 8 * 7 + 4, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 8 * 8 + 4, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 9 + 4, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 10 + 4, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 8 * 11 + 4, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 8 * 12 + 4, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 13 + 4, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 8 * 14 + 4, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 8 * 15 + 4, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                __m512 _r4 = _mm512_load_ps(pp + 16 * 4);
                __m512 _r5 = _mm512_load_ps(pp + 16 * 5);
                __m512 _r6 = _mm512_load_ps(pp + 16 * 6);
                __m512 _r7 = _mm512_load_ps(pp + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_storeu_ps(p0, _r0);
                _mm512_storeu_ps(p0 + 16, _r1);
                _mm512_storeu_ps(p0 + 16 * 2, _r2);
                _mm512_storeu_ps(p0 + 16 * 3, _r3);
                _mm512_storeu_ps(p0 + 16 * 4, _r4);
                _mm512_storeu_ps(p0 + 16 * 5, _r5);
                _mm512_storeu_ps(p0 + 16 * 6, _r6);
                _mm512_storeu_ps(p0 + 16 * 7, _r7);
                pp += 128;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm512_extractf32x4_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm512_extractf32x4_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2, _mm512_extractf32x4_ps(_r0, 2));
                _mm_store_ps(p0 + 8 * 3, _mm512_extractf32x4_ps(_r0, 3));
                _mm_store_ps(p0 + 8 * 4, _mm512_extractf32x4_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 5, _mm512_extractf32x4_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 6, _mm512_extractf32x4_ps(_r1, 2));
                _mm_store_ps(p0 + 8 * 7, _mm512_extractf32x4_ps(_r1, 3));
                _mm_store_ps(p0 + 8 * 8, _mm512_extractf32x4_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 9, _mm512_extractf32x4_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 10, _mm512_extractf32x4_ps(_r2, 2));
                _mm_store_ps(p0 + 8 * 11, _mm512_extractf32x4_ps(_r2, 3));
                _mm_store_ps(p0 + 8 * 12, _mm512_extractf32x4_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 13, _mm512_extractf32x4_ps(_r3, 1));
                _mm_store_ps(p0 + 8 * 14, _mm512_extractf32x4_ps(_r3, 2));
                _mm_store_ps(p0 + 8 * 15, _mm512_extractf32x4_ps(_r3, 3));
                pp += 64;
                p0 += out_hstep * 8;
            }
        }
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                __m512 _r1 = _mm512_load_ps(pp + 16);
                __m512 _r2 = _mm512_load_ps(pp + 16 * 2);
                __m512 _r3 = _mm512_load_ps(pp + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_storeu_ps(p0, _r0);
                _mm512_storeu_ps(p0 + 16, _r1);
                _mm512_storeu_ps(p0 + 16 * 2, _r2);
                _mm512_storeu_ps(p0 + 16 * 3, _r3);
                pp += 64;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m512 _r0 = _mm512_load_ps(pp);
                _mm512_storeu_ps(p0, _r0);
                pp += 16;
                p0 += out_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                    __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                    __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                    __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                    __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                    transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                    _mm256_storeu_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 12, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm256_extractf128_ps(_r1, 1));
                    _mm256_store_ps(p0 + 16 + 8, _r2);
                    _mm256_storeu_ps(p0 + 16 * 2 + 4, _r3);
                    _mm_store_ps(p0 + 16 * 2 + 12, _mm256_extractf128_ps(_r4, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm256_extractf128_ps(_r4, 1));
                    _mm256_store_ps(p0 + 16 * 3 + 8, _r5);
                    _mm256_storeu_ps(p0 + 16 * 4 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 4 + 12, _mm256_extractf128_ps(_r7, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm256_extractf128_ps(_r7, 1));
                    _mm256_store_ps(p0 + 16 * 5 + 8, _r8);
                    _mm256_storeu_ps(p0 + 16 * 6 + 4, _r9);
                    _mm_store_ps(p0 + 16 * 6 + 12, _mm256_extractf128_ps(_ra, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm256_extractf128_ps(_ra, 1));
                    _mm256_store_ps(p0 + 16 * 7 + 8, _rb);
                    pp += 96;
                    jj += 12;
                }
                else
                {
                    transpose8x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _mm256_extractf128_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 4, _mm256_extractf128_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 4, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 3 + 4, _mm256_extractf128_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 4 + 4, _mm256_extractf128_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 5 + 4, _mm256_extractf128_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 6 + 4, _mm256_extractf128_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 7 + 4, _mm256_extractf128_ps(_r3, 1));
                    pp += 32;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                if (max_jj > 4)
                {
                    __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                    transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                    _mm256_store_ps(p0 + 8, _r0);
                    _mm256_store_ps(p0 + 16 + 8, _r1);
                    _mm256_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm256_store_ps(p0 + 16 * 3 + 8, _r3);
                    _mm256_store_ps(p0 + 16 * 4 + 8, _r4);
                    _mm256_store_ps(p0 + 16 * 5 + 8, _r5);
                    _mm256_store_ps(p0 + 16 * 6 + 8, _r6);
                    _mm256_store_ps(p0 + 16 * 7 + 8, _r7);
                    pp += 64;
                    jj += 8;
                }
                else
                {
                    transpose8x4_ps(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r0, 0));
                    _mm_store_ps(p0 + 16 + 8, _mm256_extractf128_ps(_r0, 1));
                    _mm_store_ps(p0 + 16 * 2 + 8, _mm256_extractf128_ps(_r1, 0));
                    _mm_store_ps(p0 + 16 * 3 + 8, _mm256_extractf128_ps(_r1, 1));
                    _mm_store_ps(p0 + 16 * 4 + 8, _mm256_extractf128_ps(_r2, 0));
                    _mm_store_ps(p0 + 16 * 5 + 8, _mm256_extractf128_ps(_r2, 1));
                    _mm_store_ps(p0 + 16 * 6 + 8, _mm256_extractf128_ps(_r3, 0));
                    _mm_store_ps(p0 + 16 * 7 + 8, _mm256_extractf128_ps(_r3, 1));
                    pp += 32;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 16 + 12, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2 + 12, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 3 + 12, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 4 + 12, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 5 + 12, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 6 + 12, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 7 + 12, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                __m256 _rc = _mm256_load_ps(pp + 8 * 12);
                __m256 _rd = _mm256_load_ps(pp + 8 * 13);
                __m256 _re = _mm256_load_ps(pp + 8 * 14);
                __m256 _rf = _mm256_load_ps(pp + 8 * 15);
                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm256_store_ps(p0, _r0);
                _mm256_store_ps(p0 + 8, _r1);
                _mm256_store_ps(p0 + 8 * 2, _r2);
                _mm256_store_ps(p0 + 8 * 3, _r3);
                _mm256_store_ps(p0 + 8 * 4, _r4);
                _mm256_store_ps(p0 + 8 * 5, _r5);
                _mm256_store_ps(p0 + 8 * 6, _r6);
                _mm256_store_ps(p0 + 8 * 7, _r7);
                _mm256_store_ps(p0 + 8 * 8, _r8);
                _mm256_store_ps(p0 + 8 * 9, _r9);
                _mm256_store_ps(p0 + 8 * 10, _ra);
                _mm256_store_ps(p0 + 8 * 11, _rb);
                _mm256_store_ps(p0 + 8 * 12, _rc);
                _mm256_store_ps(p0 + 8 * 13, _rd);
                _mm256_store_ps(p0 + 8 * 14, _re);
                _mm256_store_ps(p0 + 8 * 15, _rf);
                pp += 128;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                __m256 _r8 = _mm256_load_ps(pp + 8 * 8);
                __m256 _r9 = _mm256_load_ps(pp + 8 * 9);
                __m256 _ra = _mm256_load_ps(pp + 8 * 10);
                __m256 _rb = _mm256_load_ps(pp + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16, _mm256_extractf128_ps(_r1, 1));
                _mm256_storeu_ps(p0 + 16 + 4, _r2);
                _mm256_store_ps(p0 + 16 * 2, _r3);
                _mm_store_ps(p0 + 16 * 2 + 8, _mm256_extractf128_ps(_r4, 0));
                _mm_store_ps(p0 + 16 * 3, _mm256_extractf128_ps(_r4, 1));
                _mm256_storeu_ps(p0 + 16 * 3 + 4, _r5);
                _mm256_store_ps(p0 + 16 * 4, _r6);
                _mm_store_ps(p0 + 16 * 4 + 8, _mm256_extractf128_ps(_r7, 0));
                _mm_store_ps(p0 + 16 * 5, _mm256_extractf128_ps(_r7, 1));
                _mm256_storeu_ps(p0 + 16 * 5 + 4, _r8);
                _mm256_store_ps(p0 + 16 * 6, _r9);
                _mm_store_ps(p0 + 16 * 6 + 8, _mm256_extractf128_ps(_ra, 0));
                _mm_store_ps(p0 + 16 * 7, _mm256_extractf128_ps(_ra, 1));
                _mm256_storeu_ps(p0 + 16 * 7 + 4, _rb);
                pp += 96;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(p0, _r0);
                _mm256_store_ps(p0 + 16, _r1);
                _mm256_store_ps(p0 + 16 * 2, _r2);
                _mm256_store_ps(p0 + 16 * 3, _r3);
                _mm256_store_ps(p0 + 16 * 4, _r4);
                _mm256_store_ps(p0 + 16 * 5, _r5);
                _mm256_store_ps(p0 + 16 * 6, _r6);
                _mm256_store_ps(p0 + 16 * 7, _r7);
                pp += 64;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 16, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 16 * 2, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 16 * 3, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 16 * 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 16 * 5, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 16 * 6, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 16 * 7, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 8 + 4, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2 + 4, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 3 + 4, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 4 + 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 5 + 4, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 6 + 4, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 7 + 4, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                __m256 _r4 = _mm256_load_ps(pp + 8 * 4);
                __m256 _r5 = _mm256_load_ps(pp + 8 * 5);
                __m256 _r6 = _mm256_load_ps(pp + 8 * 6);
                __m256 _r7 = _mm256_load_ps(pp + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(p0, _r0);
                _mm256_storeu_ps(p0 + 8, _r1);
                _mm256_storeu_ps(p0 + 8 * 2, _r2);
                _mm256_storeu_ps(p0 + 8 * 3, _r3);
                _mm256_storeu_ps(p0 + 8 * 4, _r4);
                _mm256_storeu_ps(p0 + 8 * 5, _r5);
                _mm256_storeu_ps(p0 + 8 * 6, _r6);
                _mm256_storeu_ps(p0 + 8 * 7, _r7);
                pp += 64;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _mm256_extractf128_ps(_r0, 0));
                _mm_store_ps(p0 + 8, _mm256_extractf128_ps(_r0, 1));
                _mm_store_ps(p0 + 8 * 2, _mm256_extractf128_ps(_r1, 0));
                _mm_store_ps(p0 + 8 * 3, _mm256_extractf128_ps(_r1, 1));
                _mm_store_ps(p0 + 8 * 4, _mm256_extractf128_ps(_r2, 0));
                _mm_store_ps(p0 + 8 * 5, _mm256_extractf128_ps(_r2, 1));
                _mm_store_ps(p0 + 8 * 6, _mm256_extractf128_ps(_r3, 0));
                _mm_store_ps(p0 + 8 * 7, _mm256_extractf128_ps(_r3, 1));
                pp += 32;
                p0 += out_hstep * 8;
            }
        }
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                __m256 _r1 = _mm256_load_ps(pp + 8);
                __m256 _r2 = _mm256_load_ps(pp + 8 * 2);
                __m256 _r3 = _mm256_load_ps(pp + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(p0, _r0);
                _mm256_storeu_ps(p0 + 8, _r1);
                _mm256_storeu_ps(p0 + 8 * 2, _r2);
                _mm256_storeu_ps(p0 + 8 * 3, _r3);
                pp += 32;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m256 _r0 = _mm256_load_ps(pp);
                _mm256_storeu_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                    __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                    __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                    __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                    __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                    __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                    __m128 _ra = _mm_load_ps(pp + 4 * 10);
                    __m128 _rb = _mm_load_ps(pp + 4 * 11);
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                    _mm_store_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 4 + 4, _r4);
                    _mm_store_ps(p0 + 4 + 8, _r8);
                    _mm_store_ps(p0 + 16 + 4, _r1);
                    _mm_store_ps(p0 + 16 + 4 + 4, _r5);
                    _mm_store_ps(p0 + 16 + 4 + 8, _r9);
                    _mm_store_ps(p0 + 16 * 2 + 4, _r2);
                    _mm_store_ps(p0 + 16 * 2 + 4 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 2 + 4 + 8, _ra);
                    _mm_store_ps(p0 + 16 * 3 + 4, _r3);
                    _mm_store_ps(p0 + 16 * 3 + 4 + 4, _r7);
                    _mm_store_ps(p0 + 16 * 3 + 4 + 8, _rb);
                    pp += 48;
                    jj += 12;
                }
                else
                {
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 16 + 4, _r1);
                    _mm_store_ps(p0 + 16 * 2 + 4, _r2);
                    _mm_store_ps(p0 + 16 * 3 + 4, _r3);
                    pp += 16;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                if (max_jj > 4)
                {
                    __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                    __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                    __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                    __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _mm_store_ps(p0 + 8, _r0);
                    _mm_store_ps(p0 + 8 + 4, _r4);
                    _mm_store_ps(p0 + 16 + 8, _r1);
                    _mm_store_ps(p0 + 16 + 8 + 4, _r5);
                    _mm_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm_store_ps(p0 + 16 * 2 + 8 + 4, _r6);
                    _mm_store_ps(p0 + 16 * 3 + 8, _r3);
                    _mm_store_ps(p0 + 16 * 3 + 8 + 4, _r7);
                    pp += 32;
                    jj += 8;
                }
                else
                {
                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _mm_store_ps(p0 + 8, _r0);
                    _mm_store_ps(p0 + 16 + 8, _r1);
                    _mm_store_ps(p0 + 16 * 2 + 8, _r2);
                    _mm_store_ps(p0 + 16 * 3 + 8, _r3);
                    pp += 16;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 12, _r0);
                _mm_store_ps(p0 + 16 + 12, _r1);
                _mm_store_ps(p0 + 16 * 2 + 12, _r2);
                _mm_store_ps(p0 + 16 * 3 + 12, _r3);
                pp += 16;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                __m128 _ra = _mm_load_ps(pp + 4 * 10);
                __m128 _rb = _mm_load_ps(pp + 4 * 11);
                __m128 _rc = _mm_load_ps(pp + 4 * 12);
                __m128 _rd = _mm_load_ps(pp + 4 * 13);
                __m128 _re = _mm_load_ps(pp + 4 * 14);
                __m128 _rf = _mm_load_ps(pp + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 4 * 2, _r8);
                _mm_store_ps(p0 + 4 * 3, _rc);
                _mm_store_ps(p0 + 4 * 4, _r1);
                _mm_store_ps(p0 + 4 * 5, _r5);
                _mm_store_ps(p0 + 4 * 6, _r9);
                _mm_store_ps(p0 + 4 * 7, _rd);
                _mm_store_ps(p0 + 4 * 8, _r2);
                _mm_store_ps(p0 + 4 * 9, _r6);
                _mm_store_ps(p0 + 4 * 10, _ra);
                _mm_store_ps(p0 + 4 * 11, _re);
                _mm_store_ps(p0 + 4 * 12, _r3);
                _mm_store_ps(p0 + 4 * 13, _r7);
                _mm_store_ps(p0 + 4 * 14, _rb);
                _mm_store_ps(p0 + 4 * 15, _rf);
                pp += 64;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                __m128 _r8 = _mm_load_ps(pp + 4 * 8);
                __m128 _r9 = _mm_load_ps(pp + 4 * 9);
                __m128 _ra = _mm_load_ps(pp + 4 * 10);
                __m128 _rb = _mm_load_ps(pp + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 8, _r8);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 + 4, _r5);
                _mm_store_ps(p0 + 16 + 8, _r9);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 2 + 4, _r6);
                _mm_store_ps(p0 + 16 * 2 + 8, _ra);
                _mm_store_ps(p0 + 16 * 3, _r3);
                _mm_store_ps(p0 + 16 * 3 + 4, _r7);
                _mm_store_ps(p0 + 16 * 3 + 8, _rb);
                pp += 48;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 4, _r4);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 + 4, _r5);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 2 + 4, _r6);
                _mm_store_ps(p0 + 16 * 3, _r3);
                _mm_store_ps(p0 + 16 * 3 + 4, _r7);
                pp += 32;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 16, _r1);
                _mm_store_ps(p0 + 16 * 2, _r2);
                _mm_store_ps(p0 + 16 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0 + 4, _r0);
                _mm_store_ps(p0 + 8 + 4, _r1);
                _mm_store_ps(p0 + 8 * 2 + 4, _r2);
                _mm_store_ps(p0 + 8 * 3 + 4, _r3);
                pp += 16;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                __m128 _r4 = _mm_load_ps(pp + 4 * 4);
                __m128 _r5 = _mm_load_ps(pp + 4 * 5);
                __m128 _r6 = _mm_load_ps(pp + 4 * 6);
                __m128 _r7 = _mm_load_ps(pp + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_storeu_ps(p0, _r0);
                _mm_storeu_ps(p0 + 4, _r4);
                _mm_storeu_ps(p0 + 4 * 2, _r1);
                _mm_storeu_ps(p0 + 4 * 3, _r5);
                _mm_storeu_ps(p0 + 4 * 4, _r2);
                _mm_storeu_ps(p0 + 4 * 5, _r6);
                _mm_storeu_ps(p0 + 4 * 6, _r3);
                _mm_storeu_ps(p0 + 4 * 7, _r7);
                pp += 32;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _r1);
                _mm_store_ps(p0 + 8 * 2, _r2);
                _mm_store_ps(p0 + 8 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_load_ps(pp);
                __m128 _r1 = _mm_load_ps(pp + 4);
                __m128 _r2 = _mm_load_ps(pp + 4 * 2);
                __m128 _r3 = _mm_load_ps(pp + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_storeu_ps(p0, _r0);
                _mm_storeu_ps(p0 + 4, _r1);
                _mm_storeu_ps(p0 + 4 * 2, _r2);
                _mm_storeu_ps(p0 + 4 * 3, _r3);
                pp += 16;
                p0 += out_hstep * 4;
            }
        }
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                __m128 _r0 = _mm_load_ps(pp);
                _mm_storeu_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    p0[0 + 4] = pp[0];
                    p0[1 + 4] = pp[2];
                    p0[2 + 4] = pp[4];
                    p0[3 + 4] = pp[6];
                    p0[4 + 4] = pp[8];
                    p0[5 + 4] = pp[10];
                    p0[6 + 4] = pp[12];
                    p0[7 + 4] = pp[14];
                    p0[8 + 4] = pp[16];
                    p0[9 + 4] = pp[18];
                    p0[10 + 4] = pp[20];
                    p0[11 + 4] = pp[22];
                    p0[16 + 4] = pp[1];
                    p0[17 + 4] = pp[3];
                    p0[18 + 4] = pp[5];
                    p0[19 + 4] = pp[7];
                    p0[20 + 4] = pp[9];
                    p0[21 + 4] = pp[11];
                    p0[22 + 4] = pp[13];
                    p0[23 + 4] = pp[15];
                    p0[24 + 4] = pp[17];
                    p0[25 + 4] = pp[19];
                    p0[26 + 4] = pp[21];
                    p0[27 + 4] = pp[23];
                    pp += 24;
                    jj += 12;
                }
                else
                {
                    p0[0 + 4] = pp[0];
                    p0[1 + 4] = pp[2];
                    p0[2 + 4] = pp[4];
                    p0[3 + 4] = pp[6];
                    p0[16 + 4] = pp[1];
                    p0[17 + 4] = pp[3];
                    p0[18 + 4] = pp[5];
                    p0[19 + 4] = pp[7];
                    pp += 8;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                if (max_jj > 4)
                {
                    p0[0 + 8] = pp[0];
                    p0[1 + 8] = pp[2];
                    p0[2 + 8] = pp[4];
                    p0[3 + 8] = pp[6];
                    p0[4 + 8] = pp[8];
                    p0[5 + 8] = pp[10];
                    p0[6 + 8] = pp[12];
                    p0[7 + 8] = pp[14];
                    p0[16 + 8] = pp[1];
                    p0[17 + 8] = pp[3];
                    p0[18 + 8] = pp[5];
                    p0[19 + 8] = pp[7];
                    p0[20 + 8] = pp[9];
                    p0[21 + 8] = pp[11];
                    p0[22 + 8] = pp[13];
                    p0[23 + 8] = pp[15];
                    pp += 16;
                    jj += 8;
                }
                else
                {
                    p0[0 + 8] = pp[0];
                    p0[1 + 8] = pp[2];
                    p0[2 + 8] = pp[4];
                    p0[3 + 8] = pp[6];
                    p0[16 + 8] = pp[1];
                    p0[17 + 8] = pp[3];
                    p0[18 + 8] = pp[5];
                    p0[19 + 8] = pp[7];
                    pp += 8;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                p0[0 + 12] = pp[0];
                p0[1 + 12] = pp[2];
                p0[2 + 12] = pp[4];
                p0[3 + 12] = pp[6];
                p0[16 + 12] = pp[1];
                p0[17 + 12] = pp[3];
                p0[18 + 12] = pp[5];
                p0[19 + 12] = pp[7];
                pp += 8;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[16];
                p0[9] = pp[18];
                p0[10] = pp[20];
                p0[11] = pp[22];
                p0[12] = pp[24];
                p0[13] = pp[26];
                p0[14] = pp[28];
                p0[15] = pp[30];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                p0[24] = pp[17];
                p0[25] = pp[19];
                p0[26] = pp[21];
                p0[27] = pp[23];
                p0[28] = pp[25];
                p0[29] = pp[27];
                p0[30] = pp[29];
                p0[31] = pp[31];
                pp += 32;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[16];
                p0[9] = pp[18];
                p0[10] = pp[20];
                p0[11] = pp[22];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                p0[24] = pp[17];
                p0[25] = pp[19];
                p0[26] = pp[21];
                p0[27] = pp[23];
                pp += 24;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                p0[20] = pp[9];
                p0[21] = pp[11];
                p0[22] = pp[13];
                p0[23] = pp[15];
                pp += 16;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[16] = pp[1];
                p0[17] = pp[3];
                p0[18] = pp[5];
                p0[19] = pp[7];
                pp += 8;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                p0[0 + 4] = pp[0];
                p0[1 + 4] = pp[2];
                p0[2 + 4] = pp[4];
                p0[3 + 4] = pp[6];
                p0[8 + 4] = pp[1];
                p0[9 + 4] = pp[3];
                p0[10 + 4] = pp[5];
                p0[11 + 4] = pp[7];
                pp += 8;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[8];
                p0[5] = pp[10];
                p0[6] = pp[12];
                p0[7] = pp[14];
                p0[8] = pp[1];
                p0[9] = pp[3];
                p0[10] = pp[5];
                p0[11] = pp[7];
                p0[12] = pp[9];
                p0[13] = pp[11];
                p0[14] = pp[13];
                p0[15] = pp[15];
                pp += 16;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[8] = pp[1];
                p0[9] = pp[3];
                p0[10] = pp[5];
                p0[11] = pp[7];
                pp += 8;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[2];
                p0[2] = pp[4];
                p0[3] = pp[6];
                p0[4] = pp[1];
                p0[5] = pp[3];
                p0[6] = pp[5];
                p0[7] = pp[7];
                pp += 8;
                p0 += out_hstep * 4;
            }
        }
#endif // __SSE2__
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                p0[0] = pp[0];
                p0[1] = pp[1];
                pp += 2;
                p0 += out_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            float* p0 = (float*)top_blob + (j / 16 * 16) * out_hstep + (i + ii) * 16;

            int jj = 0;
            if (j % 16 == 4)
            {
                if (max_jj > 4)
                {
                    // assert max_jj > 8
                    __m256 _r0 = _mm256_loadu_ps(pp);
                    __m128 _r1 = _mm_loadu_ps(pp + 8);
                    _mm256_storeu_ps(p0 + 4, _r0);
                    _mm_store_ps(p0 + 4 + 8, _r1);
                    pp += 12;
                    jj += 12;
                }
                else
                {
                    __m128 _r0 = _mm_loadu_ps(pp);
                    _mm_storeu_ps(p0 + 4, _r0);
                    pp += 4;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 8)
            {
                if (max_jj > 4)
                {
                    __m256 _r0 = _mm256_loadu_ps(pp);
                    _mm256_store_ps(p0 + 8, _r0);
                    pp += 8;
                    jj += 8;
                }
                else
                {
                    __m128 _r0 = _mm_loadu_ps(pp);
                    _mm_store_ps(p0 + 8, _r0);
                    pp += 4;
                    jj += 4;
                }
                p0 += out_hstep * 16;
            }
            if (j % 16 == 12)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0 + 12, _r0);
                pp += 4;
                p0 += out_hstep * 16;
                jj += 4;
            }
            for (; jj + 15 < max_jj; jj += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(pp);
                _mm512_store_ps(p0, _r0);
                pp += 16;
                p0 += out_hstep * 16;
            }
            for (; jj + 11 < max_jj; jj += 12)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                __m128 _r1 = _mm_loadu_ps(pp + 8);
                _mm256_store_ps(p0, _r0);
                _mm_store_ps(p0 + 8, _r1);
                pp += 12;
                p0 += out_hstep * 16;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                _mm256_store_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep * 16;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (out_elempack == 8)
        {
            float* p0 = (float*)top_blob + (j / 8 * 8) * out_hstep + (i + ii) * 8;

            int jj = 0;
            if (j % 8 == 4)
            {
                p0[0 + 4] = pp[0];
                p0[1 + 4] = pp[1];
                p0[2 + 4] = pp[2];
                p0[3 + 4] = pp[3];
                pp += 4;
                p0 += out_hstep * 8;
                jj += 4;
            }
            for (; jj + 7 < max_jj; jj += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(pp);
                _mm256_store_ps(p0, _r0);
                pp += 8;
                p0 += out_hstep * 8;
            }
            for (; jj + 3 < max_jj; jj += 4)
            {
                p0[0] = pp[0];
                p0[1] = pp[1];
                p0[2] = pp[2];
                p0[3] = pp[3];
                pp += 4;
                p0 += out_hstep * 8;
            }
        }
#endif // __AVX__
        if (out_elempack == 4)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii) * 4;

            for (int jj = 0; jj + 3 < max_jj; jj += 4)
            {
                __m128 _r0 = _mm_loadu_ps(pp);
                _mm_store_ps(p0, _r0);
                pp += 4;
                p0 += out_hstep * 4;
            }
        }
#endif // __SSE2__
        if (out_elempack == 1)
        {
            float* p0 = (float*)top_blob + j * out_hstep + (i + ii);

            for (int jj = 0; jj < max_jj; jj += 1)
            {
                p0[0] = pp[0];
                pp += 1;
                p0 += out_hstep;
            }
        }
    }
}